

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O1

bool __thiscall gss::innards::HomomorphismModel::prepare(HomomorphismModel *this)

{
  size_t *psVar1;
  pointer *pppVar2;
  ulong *puVar3;
  byte *pbVar4;
  BitWord **ppBVar5;
  undefined1 *puVar6;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var7;
  vector<int,_std::allocator<int>_> *pvVar8;
  pointer pvVar9;
  pair<int,_int> pVar10;
  Proof *pPVar11;
  ulong uVar12;
  long lVar13;
  pointer ppVar14;
  pointer ppVar15;
  bool bVar16;
  _List_node_base *p_Var17;
  long lVar18;
  SVOBitset *pSVar19;
  void *__dest;
  pointer ppVar20;
  undefined8 uVar21;
  value_type *pvVar22;
  UnsupportedConfiguration *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  ProofError *this_01;
  uint uVar24;
  int iVar25;
  int iVar26;
  long *plVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined4 uVar32;
  int iVar33;
  BitWord BVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __i;
  pointer ppVar40;
  byte bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  ulong local_4d8;
  uint next_pattern_supplemental;
  ulong local_4c8;
  ulong local_4c0;
  uint next_target_supplemental;
  long *local_4b0;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> t_gds;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_490;
  char local_480;
  vector<int,_std::allocator<int>_> n_p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_460;
  size_t local_450;
  ulong local_448;
  long *local_440;
  vector<int,_std::allocator<int>_> n_t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  size_t local_410;
  NamedVertex named_p_1;
  value_type np;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targets;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_340 [6];
  uint local_2d8;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  between_p_and_q;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  value_type n2_t;
  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  named_two_away_from_t;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  patterns;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1e0 [6];
  uint local_178;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  named_n_t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  long local_138;
  ulong local_130;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  named_n_t_w;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> p_gds;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [6];
  uint local_88;
  ulong local_80;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  d3_from_t;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  named_d_n_t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  
  bVar16 = is_nonshrinking(((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                           _M_head_impl)->params);
  if ((bVar16) && (this->target_size < this->pattern_size)) {
LAB_00131e1b:
    bVar16 = false;
  }
  else {
    _Var7._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    ppBVar5 = &np._data.long_data + 2;
    np._data.long_data = (BitWord *)ppBVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&np,"original","");
    p_Var17 = (_List_node_base *)operator_new(0x30);
    p_Var17[1]._M_next = p_Var17 + 2;
    if ((BitWord **)np._data.short_data[0] == ppBVar5) {
      p_Var17[2]._M_next =
           (_List_node_base *)CONCAT71(np._data.short_data[2]._1_7_,np._data.short_data[2]._0_1_);
      p_Var17[2]._M_prev = (_List_node_base *)np._data.short_data[3];
    }
    else {
      p_Var17[1]._M_next = (_List_node_base *)np._data.short_data[0];
      p_Var17[2]._M_next =
           (_List_node_base *)CONCAT71(np._data.short_data[2]._1_7_,np._data.short_data[2]._0_1_);
    }
    p_Var17[1]._M_prev = (_List_node_base *)np._data.short_data[1];
    np._data.short_data[1] = 0;
    np._data.short_data[2]._0_1_ = 0;
    np._data.long_data = (BitWord *)ppBVar5;
    std::__detail::_List_node_base::_M_hook(p_Var17);
    psVar1 = (size_t *)((long)&(_Var7._M_head_impl)->supplemental_graph_names + 0x10);
    *psVar1 = *psVar1 + 1;
    if ((BitWord **)np._data.short_data[0] != ppBVar5) {
      operator_delete(np._data.long_data,
                      CONCAT71(np._data.short_data[2]._1_7_,np._data.short_data[2]._0_1_) + 1);
    }
    _Var7._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    pvVar8 = *(vector<int,_std::allocator<int>_> **)
              &((_Var7._M_head_impl)->patterns_degrees).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ;
    lVar18 = (long)*(pointer *)((long)&(_Var7._M_head_impl)->patterns_degrees + 8) - (long)pvVar8;
    if (lVar18 == 0) {
LAB_001341ff:
      uVar29 = (lVar18 >> 3) * -0x5555555555555555;
      uVar30 = 0;
LAB_00134213:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar30,
                 uVar29);
    }
    std::vector<int,_std::allocator<int>_>::resize(pvVar8,(ulong)this->pattern_size);
    _Var7._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    pvVar8 = *(vector<int,_std::allocator<int>_> **)
              &((_Var7._M_head_impl)->targets_degrees).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ;
    lVar18 = (long)*(pointer *)((long)&(_Var7._M_head_impl)->targets_degrees + 8) - (long)pvVar8;
    if (lVar18 == 0) goto LAB_001341ff;
    std::vector<int,_std::allocator<int>_>::resize(pvVar8,(ulong)this->target_size);
    if (this->pattern_size != 0) {
      _Var7._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      lVar39 = *(long *)&((_Var7._M_head_impl)->pattern_graph_rows).
                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
      ;
      plVar27 = *(long **)&((_Var7._M_head_impl)->patterns_degrees).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ;
      pvVar9 = *(pointer *)((long)&(_Var7._M_head_impl)->patterns_degrees + 8);
      uVar30 = 0;
      auVar51 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        lVar18 = (ulong)(this->max_graphs * (int)uVar30) * 0x88;
        uVar29 = (ulong)*(uint *)(lVar39 + 0x80 + lVar18);
        if (uVar29 < 0x11) {
          lVar18 = lVar18 + lVar39;
        }
        else {
          lVar18 = *(long *)(lVar39 + lVar18);
        }
        if (uVar29 == 0) {
          uVar32 = 0;
        }
        else {
          auVar52 = vpbroadcastq_avx512f();
          uVar37 = 0;
          auVar53 = ZEXT1664((undefined1  [16])0x0);
          do {
            auVar55 = auVar53;
            auVar53 = vpbroadcastq_avx512f();
            auVar53 = vporq_avx512f(auVar53,auVar51);
            uVar31 = vpcmpuq_avx512f(auVar53,auVar52,2);
            auVar53 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar18 + uVar37 * 8));
            auVar54._8_8_ = (ulong)((byte)(uVar31 >> 1) & 1) * auVar53._8_8_;
            auVar54._0_8_ = (ulong)((byte)uVar31 & 1) * auVar53._0_8_;
            auVar54._16_8_ = (ulong)((byte)(uVar31 >> 2) & 1) * auVar53._16_8_;
            auVar54._24_8_ = (ulong)((byte)(uVar31 >> 3) & 1) * auVar53._24_8_;
            auVar54._32_8_ = (ulong)((byte)(uVar31 >> 4) & 1) * auVar53._32_8_;
            auVar54._40_8_ = (ulong)((byte)(uVar31 >> 5) & 1) * auVar53._40_8_;
            auVar54._48_8_ = (ulong)((byte)(uVar31 >> 6) & 1) * auVar53._48_8_;
            auVar54._56_8_ = (uVar31 >> 7) * auVar53._56_8_;
            auVar53 = vpopcntq_avx512_vpopcntdq(auVar54);
            auVar46 = vpmovqd_avx512f(auVar53);
            auVar46 = vpaddd_avx2(auVar55._0_32_,auVar46);
            uVar37 = uVar37 + 8;
            auVar53 = ZEXT3264(auVar46);
          } while ((uVar29 + 7 & 0x1fffffff8) != uVar37);
          auVar46 = vmovdqa32_avx512vl(auVar46);
          bVar16 = (bool)((byte)uVar31 & 1);
          auVar42._0_4_ = (uint)bVar16 * auVar46._0_4_ | (uint)!bVar16 * auVar55._0_4_;
          bVar16 = (bool)((byte)(uVar31 >> 1) & 1);
          auVar42._4_4_ = (uint)bVar16 * auVar46._4_4_ | (uint)!bVar16 * auVar55._4_4_;
          bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
          auVar42._8_4_ = (uint)bVar16 * auVar46._8_4_ | (uint)!bVar16 * auVar55._8_4_;
          bVar16 = (bool)((byte)(uVar31 >> 3) & 1);
          auVar42._12_4_ = (uint)bVar16 * auVar46._12_4_ | (uint)!bVar16 * auVar55._12_4_;
          bVar16 = (bool)((byte)(uVar31 >> 4) & 1);
          auVar47._16_4_ = (uint)bVar16 * auVar46._16_4_ | (uint)!bVar16 * auVar55._16_4_;
          auVar47._0_16_ = auVar42;
          bVar16 = (bool)((byte)(uVar31 >> 5) & 1);
          auVar47._20_4_ = (uint)bVar16 * auVar46._20_4_ | (uint)!bVar16 * auVar55._20_4_;
          bVar16 = (bool)((byte)(uVar31 >> 6) & 1);
          auVar47._24_4_ = (uint)bVar16 * auVar46._24_4_ | (uint)!bVar16 * auVar55._24_4_;
          bVar16 = SUB81(uVar31 >> 7,0);
          auVar47._28_4_ = (uint)bVar16 * auVar46._28_4_ | (uint)!bVar16 * auVar55._28_4_;
          auVar42 = vphaddd_avx(auVar47._16_16_,auVar42);
          auVar42 = vphaddd_avx(auVar42,auVar42);
          auVar42 = vphaddd_avx(auVar42,auVar42);
          uVar32 = auVar42._0_4_;
        }
        lVar18 = (long)pvVar9 - (long)plVar27;
        if (lVar18 == 0) goto LAB_001341ff;
        uVar29 = plVar27[1] - *plVar27 >> 2;
        if (uVar29 <= uVar30) goto LAB_00134213;
        *(undefined4 *)(*plVar27 + uVar30 * 4) = uVar32;
        uVar36 = (int)uVar30 + 1;
        uVar30 = (ulong)uVar36;
      } while (uVar36 < this->pattern_size);
    }
    if (this->target_size != 0) {
      _Var7._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      lVar39 = *(long *)&((_Var7._M_head_impl)->target_graph_rows).
                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
      ;
      plVar27 = *(long **)&((_Var7._M_head_impl)->targets_degrees).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ;
      pvVar9 = *(pointer *)((long)&(_Var7._M_head_impl)->targets_degrees + 8);
      uVar30 = 0;
      auVar51 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        lVar18 = (ulong)(this->max_graphs * (int)uVar30) * 0x88;
        uVar29 = (ulong)*(uint *)(lVar39 + 0x80 + lVar18);
        if (uVar29 < 0x11) {
          lVar18 = lVar18 + lVar39;
        }
        else {
          lVar18 = *(long *)(lVar39 + lVar18);
        }
        if (uVar29 == 0) {
          uVar32 = 0;
        }
        else {
          auVar52 = vpbroadcastq_avx512f();
          uVar37 = 0;
          auVar53 = ZEXT1664((undefined1  [16])0x0);
          do {
            auVar55 = auVar53;
            auVar53 = vpbroadcastq_avx512f();
            auVar53 = vporq_avx512f(auVar53,auVar51);
            uVar31 = vpcmpuq_avx512f(auVar53,auVar52,2);
            auVar54 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar18 + uVar37 * 8));
            auVar53._8_8_ = (ulong)((byte)(uVar31 >> 1) & 1) * auVar54._8_8_;
            auVar53._0_8_ = (ulong)((byte)uVar31 & 1) * auVar54._0_8_;
            auVar53._16_8_ = (ulong)((byte)(uVar31 >> 2) & 1) * auVar54._16_8_;
            auVar53._24_8_ = (ulong)((byte)(uVar31 >> 3) & 1) * auVar54._24_8_;
            auVar53._32_8_ = (ulong)((byte)(uVar31 >> 4) & 1) * auVar54._32_8_;
            auVar53._40_8_ = (ulong)((byte)(uVar31 >> 5) & 1) * auVar54._40_8_;
            auVar53._48_8_ = (ulong)((byte)(uVar31 >> 6) & 1) * auVar54._48_8_;
            auVar53._56_8_ = (uVar31 >> 7) * auVar54._56_8_;
            auVar53 = vpopcntq_avx512_vpopcntdq(auVar53);
            auVar46 = vpmovqd_avx512f(auVar53);
            auVar46 = vpaddd_avx2(auVar55._0_32_,auVar46);
            uVar37 = uVar37 + 8;
            auVar53 = ZEXT3264(auVar46);
          } while ((uVar29 + 7 & 0x1fffffff8) != uVar37);
          auVar46 = vmovdqa32_avx512vl(auVar46);
          bVar16 = (bool)((byte)uVar31 & 1);
          auVar43._0_4_ = (uint)bVar16 * auVar46._0_4_ | (uint)!bVar16 * auVar55._0_4_;
          bVar16 = (bool)((byte)(uVar31 >> 1) & 1);
          auVar43._4_4_ = (uint)bVar16 * auVar46._4_4_ | (uint)!bVar16 * auVar55._4_4_;
          bVar16 = (bool)((byte)(uVar31 >> 2) & 1);
          auVar43._8_4_ = (uint)bVar16 * auVar46._8_4_ | (uint)!bVar16 * auVar55._8_4_;
          bVar16 = (bool)((byte)(uVar31 >> 3) & 1);
          auVar43._12_4_ = (uint)bVar16 * auVar46._12_4_ | (uint)!bVar16 * auVar55._12_4_;
          bVar16 = (bool)((byte)(uVar31 >> 4) & 1);
          auVar48._16_4_ = (uint)bVar16 * auVar46._16_4_ | (uint)!bVar16 * auVar55._16_4_;
          auVar48._0_16_ = auVar43;
          bVar16 = (bool)((byte)(uVar31 >> 5) & 1);
          auVar48._20_4_ = (uint)bVar16 * auVar46._20_4_ | (uint)!bVar16 * auVar55._20_4_;
          bVar16 = (bool)((byte)(uVar31 >> 6) & 1);
          auVar48._24_4_ = (uint)bVar16 * auVar46._24_4_ | (uint)!bVar16 * auVar55._24_4_;
          bVar16 = SUB81(uVar31 >> 7,0);
          auVar48._28_4_ = (uint)bVar16 * auVar46._28_4_ | (uint)!bVar16 * auVar55._28_4_;
          auVar42 = vphaddd_avx(auVar48._16_16_,auVar43);
          auVar42 = vphaddd_avx(auVar42,auVar42);
          auVar42 = vphaddd_avx(auVar42,auVar42);
          uVar32 = auVar42._0_4_;
        }
        lVar18 = (long)pvVar9 - (long)plVar27;
        if (lVar18 == 0) goto LAB_001341ff;
        uVar29 = plVar27[1] - *plVar27 >> 2;
        if (uVar29 <= uVar30) goto LAB_00134213;
        *(undefined4 *)(*plVar27 + uVar30 * 4) = uVar32;
        uVar36 = (int)uVar30 + 1;
        uVar30 = (ulong)uVar36;
      } while (uVar36 < this->target_size);
    }
    bVar16 = global_degree_is_preserved
                       (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->params);
    if (bVar16) {
      p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar30 = 0;
      p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      np._data.short_data[0]._0_4_ = 0;
      if (this->pattern_size != 0) {
        do {
          _Var7._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
          pvVar9 = *(pointer *)
                    &((_Var7._M_head_impl)->patterns_degrees).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ;
          if (*(pointer *)((long)&(_Var7._M_head_impl)->patterns_degrees + 8) == pvVar9) {
            uVar29 = 0;
            uVar30 = 0;
LAB_00134231:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar30,uVar29);
          }
          uVar29 = (long)*(pointer *)
                          ((long)&pvVar9->super__Vector_base<int,_std::allocator<int>_> + 8) -
                   *(long *)&pvVar9->super__Vector_base<int,_std::allocator<int>_> >> 2;
          if (uVar29 <= uVar30) goto LAB_00134231;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<unsigned_int&,int&>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&p_gds,
                     (uint *)&np,
                     (int *)(*(long *)&pvVar9->super__Vector_base<int,_std::allocator<int>_> +
                            uVar30 * 4));
          np._data.short_data[0]._0_4_ = np._data.short_data[0]._0_4_ + 1;
          uVar30 = (ulong)(uint)np._data.short_data[0]._0_4_;
        } while ((uint)np._data.short_data[0]._0_4_ < this->pattern_size);
      }
      np._data.short_data[0]._0_4_ = 0;
      if (this->target_size != 0) {
        do {
          _Var7._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
          pvVar9 = *(pointer *)
                    &((_Var7._M_head_impl)->targets_degrees).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ;
          if (*(pointer *)((long)&(_Var7._M_head_impl)->targets_degrees + 8) == pvVar9) {
            uVar30 = 0;
            uVar29 = 0;
LAB_00134253:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar29,uVar30);
          }
          uVar29 = (ulong)(uint)np._data.short_data[0]._0_4_;
          uVar30 = (long)*(pointer *)
                          ((long)&pvVar9->super__Vector_base<int,_std::allocator<int>_> + 8) -
                   *(long *)&pvVar9->super__Vector_base<int,_std::allocator<int>_> >> 2;
          if (uVar30 <= uVar29) goto LAB_00134253;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<unsigned_int&,int&>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&t_gds,
                     (uint *)&np,
                     (int *)(*(long *)&pvVar9->super__Vector_base<int,_std::allocator<int>_> +
                            uVar29 * 4));
          np._data.short_data[0]._0_4_ = np._data.short_data[0]._0_4_ + 1;
        } while ((uint)np._data.short_data[0]._0_4_ < this->target_size);
      }
      ppVar14 = p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar15 = p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar18 = (long)p_gds.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)p_gds.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__0>>
                  (p_gds.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   p_gds.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar18 >> 3) * 2 ^ 0x7e);
        if (lVar18 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__0>>
                    (ppVar14,ppVar15);
        }
        else {
          ppVar40 = ppVar14 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__0>>
                    (ppVar14,ppVar40);
          for (; ppVar40 != ppVar15; ppVar40 = ppVar40 + 1) {
            pVar10 = *ppVar40;
            iVar26 = pVar10.second;
            iVar25 = ppVar40[-1].second;
            ppVar14 = ppVar40;
            while (iVar25 < iVar26) {
              *ppVar14 = ppVar14[-1];
              iVar25 = ppVar14[-2].second;
              ppVar14 = ppVar14 + -1;
            }
            ppVar14->first = pVar10.first;
            ppVar14->second = iVar26;
          }
        }
      }
      ppVar14 = t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar15 = t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar18 = (long)t_gds.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)t_gds.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__1>>
                  (t_gds.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   t_gds.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar18 >> 3) * 2 ^ 0x7e);
        if (lVar18 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__1>>
                    (ppVar14,ppVar15);
        }
        else {
          ppVar40 = ppVar14 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__1>>
                    (ppVar14,ppVar40);
          for (; ppVar40 != ppVar15; ppVar40 = ppVar40 + 1) {
            pVar10 = *ppVar40;
            iVar26 = pVar10.second;
            iVar25 = ppVar40[-1].second;
            ppVar14 = ppVar40;
            while (iVar25 < iVar26) {
              *ppVar14 = ppVar14[-1];
              iVar25 = ppVar14[-2].second;
              ppVar14 = ppVar14 + -1;
            }
            ppVar14->first = pVar10.first;
            ppVar14->second = iVar26;
          }
        }
      }
      bVar41 = (long)p_gds.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)p_gds.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start != 0;
      if ((bool)bVar41) {
        uVar30 = (long)p_gds.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)p_gds.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        local_4d8 = 0;
        do {
          if ((ulong)((long)t_gds.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)t_gds.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) <= local_4d8) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       local_4d8);
          }
          uVar36 = (uint)local_4d8;
          if (t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start[local_4d8].second <
              p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start[local_4d8].second) {
            if (*(long *)&(((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                           _M_head_impl)->proof).
                          super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0)
            {
              local_448 = CONCAT71(local_448._1_7_,bVar41);
              uVar35 = 0;
              local_4c0 = local_4d8;
              do {
                n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start = (pointer)0x0;
                n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = (pointer)0x0;
                n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage = (pointer)0x0;
                uVar30 = (ulong)uVar35;
                if ((ulong)((long)p_gds.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)p_gds.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar30) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar30);
                }
                SVOBitset::SVOBitset
                          (&np,(SVOBitset *)
                               ((ulong)(this->max_graphs *
                                       p_gds.
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar30].first) *
                                0x88 + *(long *)&(((this->_imp)._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->pattern_graph_rows).
                                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                               ));
                if (this->pattern_size != 0) {
                  uVar29 = 0;
                  do {
                    pSVar19 = &np;
                    if (0x10 < np.n_words) {
                      pSVar19 = (SVOBitset *)
                                CONCAT44(np._data.short_data[0]._4_4_,np._data.short_data[0]._0_4_);
                    }
                    iVar25 = (int)uVar29;
                    iVar26 = iVar25 + 0x3f;
                    if (-1 < iVar25) {
                      iVar26 = iVar25;
                    }
                    if (((pSVar19->_data).short_data[iVar26 >> 6] >> (uVar29 & 0x3f) & 1) != 0) {
                      patterns.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar25;
                      if (n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (&n_p,(iterator)
                                        n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish,(int *)&patterns);
                      }
                      else {
                        *n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = iVar25;
                        n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1;
                      }
                    }
                    uVar29 = (ulong)(iVar25 + 1U);
                  } while (iVar25 + 1U < this->pattern_size);
                }
                uVar29 = local_4c0;
                uVar37 = local_4d8;
                local_4c8 = uVar30;
                if (local_4c0 <
                    (ulong)((long)t_gds.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)t_gds.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3)) {
                  do {
                    n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    SVOBitset::SVOBitset
                              ((SVOBitset *)&patterns,
                               (SVOBitset *)
                               ((ulong)(this->max_graphs *
                                       t_gds.
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar29].first) *
                                0x88 + *(long *)&(((this->_imp)._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->target_graph_rows).
                                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                               ));
                    uVar30 = (ulong)local_178;
                    pSVar19 = (SVOBitset *)&patterns;
                    if (0x10 < uVar30) {
                      pSVar19 = (SVOBitset *)
                                patterns.
                                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    }
                    iVar25 = -1;
                    if (uVar30 != 0) {
                      lVar18 = 0;
                      do {
                        BVar34 = (pSVar19->_data).short_data[0];
                        if (BVar34 != 0) goto LAB_00131b02;
                        lVar18 = lVar18 + -0x40;
                        pSVar19 = (SVOBitset *)((long)&pSVar19->_data + 8);
                      } while (uVar30 * 0x40 + lVar18 != 0);
                    }
LAB_00131a4b:
                    while (iVar25 != -1) {
                      pSVar19 = (SVOBitset *)&patterns;
                      if (0x10 < local_178) {
                        pSVar19 = (SVOBitset *)
                                  patterns.
                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      }
                      bVar41 = (byte)iVar25 & 0x3f;
                      iVar26 = iVar25 + 0x3f;
                      if (-1 < iVar25) {
                        iVar26 = iVar25;
                      }
                      (pSVar19->_data).short_data[iVar26 >> 6] =
                           (pSVar19->_data).short_data[iVar26 >> 6] &
                           (-2L << bVar41 | 0xfffffffffffffffeU >> 0x40 - bVar41);
                      targets.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar25;
                      if (n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (&n_t,(iterator)
                                        n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish,(int *)&targets);
                      }
                      else {
                        *n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = iVar25;
                        n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1;
                      }
                      uVar30 = (ulong)local_178;
                      pSVar19 = (SVOBitset *)&patterns;
                      if (0x10 < uVar30) {
                        pSVar19 = (SVOBitset *)
                                  patterns.
                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      }
                      iVar25 = -1;
                      if (uVar30 != 0) {
                        lVar18 = 0;
                        do {
                          BVar34 = (pSVar19->_data).short_data[0];
                          if (BVar34 != 0) goto LAB_00131b02;
                          lVar18 = lVar18 + -0x40;
                          pSVar19 = (SVOBitset *)((long)&pSVar19->_data + 8);
                        } while (uVar30 * 0x40 + lVar18 != 0);
                      }
                    }
                    if ((ulong)((long)p_gds.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)p_gds.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= local_4c8)
                    {
                      std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
                    }
                    pPVar11 = (((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                .
                                super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                               ._M_head_impl)->proof).
                              super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr;
                    pattern_vertex_for_proof_abi_cxx11_
                              ((NamedVertex *)&targets,this,
                               p_gds.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_4c8].first);
                    if ((ulong)((long)t_gds.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)t_gds.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar29) {
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar29);
                    }
                    target_vertex_for_proof_abi_cxx11_
                              ((NamedVertex *)&n2_t,this,
                               t_gds.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar29].first);
                    Proof::incompatible_by_degrees
                              (pPVar11,0,(NamedVertex *)&targets,&n_p,(NamedVertex *)&n2_t,&n_t);
                    if ((undefined1 *)n2_t._data.short_data[1] !=
                        (undefined1 *)((long)&n2_t._data + 0x18)) {
                      operator_delete((void *)n2_t._data.short_data[1],n2_t._data.short_data[3] + 1)
                      ;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)targets.
                           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish != aaStack_340) {
                      operator_delete(targets.
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      aaStack_340[0]._M_allocated_capacity + 1);
                    }
                    if ((0x10 < local_178) &&
                       (patterns.
                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete__(patterns.
                                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start,
                                      (long)n_t.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)n_t.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    uVar29 = (ulong)((int)uVar37 + 1);
                    uVar37 = uVar29;
                    if ((ulong)((long)t_gds.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)t_gds.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar29)
                    break;
                  } while( true );
                }
                uVar30 = local_4c8;
                if ((0x10 < np.n_words) &&
                   ((void *)CONCAT44(np._data.short_data[0]._4_4_,np._data.short_data[0]._0_4_) !=
                    (void *)0x0)) {
                  operator_delete__((void *)CONCAT44(np._data.short_data[0]._4_4_,
                                                     np._data.short_data[0]._0_4_));
                }
                if (n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                uVar35 = (int)uVar30 + 1;
              } while (uVar35 <= uVar36);
              patterns.
              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              patterns.
              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              uVar30 = 0;
              patterns.
              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              targets.
              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              _targets = ZEXT4864(stack0xfffffffffffffcb8) << 0x80;
              puVar6 = (undefined1 *)((long)&np._data + 0x18);
              do {
                if ((ulong)((long)p_gds.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)p_gds.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar30) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar30);
                }
                pattern_vertex_for_proof_abi_cxx11_
                          ((NamedVertex *)&np,this,
                           p_gds.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar30].first);
                std::
                vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                ::emplace_back<std::pair<int,std::__cxx11::string>>
                          ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                            *)&patterns,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&np);
                if ((undefined1 *)np._data.short_data[1] != puVar6) {
                  operator_delete((void *)np._data.short_data[1],np._data.short_data[3] + 1);
                }
                uVar35 = (int)uVar30 + 1;
                uVar30 = (ulong)uVar35;
              } while (uVar35 <= uVar36);
              if (uVar36 != 0) {
                uVar30 = 0;
                do {
                  if ((ulong)((long)t_gds.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)t_gds.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar30) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar30);
                  }
                  target_vertex_for_proof_abi_cxx11_
                            ((NamedVertex *)&np,this,
                             t_gds.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar30].first);
                  std::
                  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  ::emplace_back<std::pair<int,std::__cxx11::string>>
                            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                              *)&targets,
                             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&np);
                  if ((undefined1 *)np._data.short_data[1] != puVar6) {
                    operator_delete((void *)np._data.short_data[1],np._data.short_data[3] + 1);
                  }
                  uVar30 = uVar30 + 1;
                  uVar36 = (int)local_4d8 - 1;
                  local_4d8 = (ulong)uVar36;
                } while (uVar36 != 0);
              }
              Proof::emit_hall_set_or_violator
                        ((((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl)->proof).
                         super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &patterns,&targets);
              std::
              vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector(&targets);
              std::
              vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector(&patterns);
              bVar41 = (byte)local_448;
            }
            break;
          }
          local_4d8 = (ulong)(uVar36 + 1);
          bVar41 = local_4d8 < uVar30;
        } while (local_4d8 < uVar30);
      }
      if (t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(t_gds.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)t_gds.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)t_gds.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(p_gds.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)p_gds.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)p_gds.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((bVar41 & 1) != 0) goto LAB_00131e1b;
    }
    next_pattern_supplemental = 1;
    next_target_supplemental = 1;
    bVar16 = supports_exact_path_graphs
                       (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->params);
    if (bVar16) {
      _Var7._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      _build_exact_path_graphs
                (this,&(_Var7._M_head_impl)->pattern_graph_rows,this->pattern_size,
                 &next_pattern_supplemental,*(uint *)((long)(_Var7._M_head_impl)->params + 0x68),
                 (_Var7._M_head_impl)->directed,false,true);
      _Var7._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      _build_exact_path_graphs
                (this,&(_Var7._M_head_impl)->target_graph_rows,this->target_size,
                 &next_target_supplemental,*(uint *)((long)(_Var7._M_head_impl)->params + 0x68),
                 (_Var7._M_head_impl)->directed,false,false);
      if ((*(long *)&(((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl)->proof).
                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0) &&
         (0 < *(int *)((long)((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                             _M_head_impl)->params + 0x68))) {
        local_4d8 = 1;
        do {
          if (this->pattern_size != 0) {
            uVar36 = 0;
            do {
              if (this->pattern_size != 0) {
                uVar30 = 0;
                local_448 = CONCAT44(local_448._4_4_,uVar36);
                do {
                  uVar35 = (uint)uVar30;
                  if (uVar36 != uVar35) {
                    lVar18 = *(long *)&(((this->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         .
                                         super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                        ._M_head_impl)->pattern_graph_rows).
                                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                    ;
                    lVar39 = (ulong)(this->max_graphs * uVar36 + (int)local_4d8) * 0x88;
                    if (*(uint *)(lVar18 + 0x80 + lVar39) < 0x11) {
                      lVar18 = lVar18 + lVar39;
                    }
                    else {
                      lVar18 = *(long *)(lVar18 + lVar39);
                    }
                    uVar24 = uVar35 + 0x3f;
                    if (-1 < (int)uVar35) {
                      uVar24 = uVar35;
                    }
                    if ((*(ulong *)(lVar18 + (long)((int)uVar24 >> 6) * 8) >> (uVar30 & 0x3f) & 1)
                        != 0) {
                      local_4c0 = uVar30;
                      pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&t_gds,this,uVar36);
                      pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&n_p,this,(int)local_4c0);
                      SVOBitset::SVOBitset
                                (&np,(SVOBitset *)
                                     ((ulong)(this->max_graphs * uVar36) * 0x88 +
                                     *(long *)&(((this->_imp)._M_t.
                                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                 .
                                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                ._M_head_impl)->pattern_graph_rows).
                                               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                     ));
                      SVOBitset::operator&=
                                (&np,(SVOBitset *)
                                     ((ulong)(this->max_graphs * (int)local_4c0) * 0x88 +
                                     *(long *)&(((this->_imp)._M_t.
                                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                 .
                                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                ._M_head_impl)->pattern_graph_rows).
                                               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                     ));
                      between_p_and_q.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      between_p_and_q.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      between_p_and_q.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      uVar30 = (ulong)np.n_words;
                      uVar21 = &np;
                      if (0x10 < uVar30) {
                        uVar21 = np._data.short_data[0];
                      }
                      iVar25 = -1;
                      if (uVar30 != 0) {
                        lVar18 = 0;
                        do {
                          BVar34 = (((SVOBitset *)uVar21)->_data).short_data[0];
                          if (BVar34 != 0) goto LAB_00132125;
                          lVar18 = lVar18 + -0x40;
                          uVar21 = (long)&((SVOBitset *)uVar21)->_data + 8;
                        } while (uVar30 * 0x40 + lVar18 != 0);
                      }
LAB_00132026:
                      while (iVar25 != -1) {
                        pvVar22 = &np;
                        if (0x10 < np.n_words) {
                          pvVar22 = (value_type *)np._data.short_data[0];
                        }
                        bVar41 = (byte)iVar25 & 0x3f;
                        iVar26 = iVar25 + 0x3f;
                        if (-1 < iVar25) {
                          iVar26 = iVar25;
                        }
                        (pvVar22->_data).short_data[iVar26 >> 6] =
                             (pvVar22->_data).short_data[iVar26 >> 6] &
                             (-2L << bVar41 | 0xfffffffffffffffeU >> 0x40 - bVar41);
                        pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&patterns,this,iVar25);
                        std::
                        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                        ::emplace_back<std::pair<int,std::__cxx11::string>>
                                  ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                    *)&between_p_and_q,(NamedVertex *)&patterns);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)patterns.
                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish != aaStack_1e0) {
                          operator_delete(patterns.
                                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,
                                          aaStack_1e0[0]._0_8_ + 1);
                        }
                        if (local_4d8 <=
                            (ulong)(((long)between_p_and_q.
                                           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)between_p_and_q.
                                           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x3333333333333333)) break;
                        uVar30 = (ulong)np.n_words;
                        pvVar22 = &np;
                        if (0x10 < uVar30) {
                          pvVar22 = (value_type *)np._data.short_data[0];
                        }
                        iVar25 = -1;
                        if (uVar30 != 0) {
                          lVar18 = 0;
                          do {
                            BVar34 = (pvVar22->_data).short_data[0];
                            if (BVar34 != 0) goto LAB_00132125;
                            lVar18 = lVar18 + -0x40;
                            pvVar22 = (value_type *)((long)&pvVar22->_data + 8);
                          } while (uVar30 * 0x40 + lVar18 != 0);
                        }
                      }
                      if (this->target_size != 0) {
                        uVar36 = 0;
                        do {
                          target_vertex_for_proof_abi_cxx11_((NamedVertex *)&n_t,this,uVar36);
                          named_n_t.
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          named_n_t.
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                          named_n_t.
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          named_d_n_t.
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          named_d_n_t.
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          named_d_n_t.
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                          named_two_away_from_t.
                          super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          named_two_away_from_t.
                          super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          named_two_away_from_t.
                          super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_4c8 = CONCAT44(local_4c8._4_4_,uVar36);
                          SVOBitset::SVOBitset
                                    ((SVOBitset *)&patterns,
                                     (SVOBitset *)
                                     ((ulong)(this->max_graphs * uVar36) * 0x88 +
                                     *(long *)&(((this->_imp)._M_t.
                                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                 .
                                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                ._M_head_impl)->target_graph_rows).
                                               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                     ));
                          uVar30 = (ulong)local_178;
                          pSVar19 = (SVOBitset *)&patterns;
                          if (0x10 < uVar30) {
                            pSVar19 = (SVOBitset *)
                                      patterns.
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                          }
                          iVar25 = -1;
                          auVar42 = (undefined1  [16])
                                    patterns.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._0_16_;
                          if (uVar30 != 0) {
                            lVar18 = 0;
LAB_001321e3:
                            BVar34 = (pSVar19->_data).short_data[0];
                            if (BVar34 == 0) goto code_r0x001321eb;
                            iVar25 = 0;
                            for (; (BVar34 & 1) == 0; BVar34 = BVar34 >> 1 | 0x8000000000000000) {
                              iVar25 = iVar25 + 1;
                            }
                            iVar25 = iVar25 - (int)lVar18;
                          }
joined_r0x00132212:
                          patterns.
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._0_16_ = auVar42;
                          if (iVar25 != -1) {
                            patterns.
                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)&patterns;
                            if (0x10 < local_178) {
                              patterns.
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start = auVar42._0_8_;
                            }
                            bVar41 = (byte)iVar25 & 0x3f;
                            iVar26 = iVar25 + 0x3f;
                            if (-1 < iVar25) {
                              iVar26 = iVar25;
                            }
                            pppVar2 = &(((_Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)&(patterns.
                                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->first)->
                                       _M_impl).super__Vector_impl_data._M_start + (iVar26 >> 6);
                            *pppVar2 = (pointer)((ulong)*pppVar2 &
                                                (-2L << bVar41 |
                                                0xfffffffffffffffeU >> 0x40 - bVar41));
                            target_vertex_for_proof_abi_cxx11_((NamedVertex *)&targets,this,iVar25);
                            std::
                            vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                            ::emplace_back<std::pair<int,std::__cxx11::string>>
                                      ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                        *)&named_n_t,
                                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&targets);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)targets.
                                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish != aaStack_340) {
                              operator_delete(targets.
                                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish,
                                              aaStack_340[0]._M_allocated_capacity + 1);
                            }
                            uVar30 = (ulong)local_178;
                            ppVar20 = (pointer)&patterns;
                            if (0x10 < uVar30) {
                              ppVar20 = patterns.
                                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                            }
                            iVar25 = -1;
                            auVar42 = (undefined1  [16])
                                      patterns.
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._0_16_;
                            if (uVar30 != 0) {
                              lVar18 = 0;
                              while (uVar29 = *(ulong *)ppVar20, uVar29 == 0) {
                                lVar18 = lVar18 + -0x40;
                                ppVar20 = (pointer)&ppVar20->second;
                                if (uVar30 * 0x40 + lVar18 == 0) goto joined_r0x00132212;
                              }
                              iVar25 = 0;
                              for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                                iVar25 = iVar25 + 1;
                              }
                              iVar25 = iVar25 - (int)lVar18;
                            }
                            goto joined_r0x00132212;
                          }
                          SVOBitset::SVOBitset
                                    ((SVOBitset *)&targets,
                                     (SVOBitset *)
                                     ((ulong)(this->max_graphs * (int)local_4c8 + (int)local_4d8) *
                                      0x88 + *(long *)&(((this->_imp)._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->target_graph_rows).
                                                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                     ));
                          uVar30 = (ulong)local_2d8;
                          pSVar19 = (SVOBitset *)&targets;
                          if (0x10 < uVar30) {
                            pSVar19 = (SVOBitset *)
                                      targets.
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                          }
                          iVar25 = -1;
                          if (uVar30 != 0) {
                            lVar18 = 0;
                            do {
                              BVar34 = (pSVar19->_data).short_data[0];
                              if (BVar34 != 0) goto LAB_0013242b;
                              lVar18 = lVar18 + -0x40;
                              pSVar19 = (SVOBitset *)((long)&pSVar19->_data + 8);
                            } while (uVar30 * 0x40 + lVar18 != 0);
                          }
LAB_00132360:
                          while (iVar25 != -1) {
                            pSVar19 = (SVOBitset *)&targets;
                            if (0x10 < local_2d8) {
                              pSVar19 = (SVOBitset *)
                                        targets.
                                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                            }
                            bVar41 = (byte)iVar25 & 0x3f;
                            iVar26 = iVar25 + 0x3f;
                            if (-1 < iVar25) {
                              iVar26 = iVar25;
                            }
                            (pSVar19->_data).short_data[iVar26 >> 6] =
                                 (pSVar19->_data).short_data[iVar26 >> 6] &
                                 (-2L << bVar41 | 0xfffffffffffffffeU >> 0x40 - bVar41);
                            target_vertex_for_proof_abi_cxx11_((NamedVertex *)&n2_t,this,iVar25);
                            std::
                            vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                            ::emplace_back<std::pair<int,std::__cxx11::string>>
                                      ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                        *)&named_d_n_t,
                                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&n2_t);
                            if ((undefined1 *)n2_t._data.short_data[1] !=
                                (undefined1 *)((long)&n2_t._data + 0x18)) {
                              operator_delete((void *)n2_t._data.short_data[1],
                                              n2_t._data.short_data[3] + 1);
                            }
                            uVar30 = (ulong)local_2d8;
                            pSVar19 = (SVOBitset *)&targets;
                            if (0x10 < uVar30) {
                              pSVar19 = (SVOBitset *)
                                        targets.
                                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                            }
                            iVar25 = -1;
                            if (uVar30 != 0) {
                              lVar18 = 0;
                              do {
                                BVar34 = (pSVar19->_data).short_data[0];
                                if (BVar34 != 0) goto LAB_0013242b;
                                lVar18 = lVar18 + -0x40;
                                pSVar19 = (SVOBitset *)((long)&pSVar19->_data + 8);
                              } while (uVar30 * 0x40 + lVar18 != 0);
                            }
                          }
                          SVOBitset::SVOBitset
                                    (&n2_t,(SVOBitset *)
                                           ((ulong)(this->max_graphs * (int)local_4c8 + 1) * 0x88 +
                                           *(long *)&(((this->_imp)._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->target_graph_rows).
                                                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                           ));
                          uVar30 = (ulong)n2_t.n_words;
                          uVar21 = &n2_t;
                          if (0x10 < uVar30) {
                            uVar21 = n2_t._data.short_data[0];
                          }
                          iVar25 = -1;
                          if (uVar30 != 0) {
                            lVar18 = 0;
                            do {
                              uVar29 = (((SVOBitset *)uVar21)->_data).short_data[0];
                              if (uVar29 != 0) goto LAB_0013270f;
                              lVar18 = lVar18 + -0x40;
                              uVar21 = (long)&((SVOBitset *)uVar21)->_data + 8;
                            } while (uVar30 * 0x40 + lVar18 != 0);
                          }
LAB_001324a6:
                          while (iVar25 != -1) {
                            uVar21 = &n2_t;
                            if (0x10 < n2_t.n_words) {
                              uVar21 = n2_t._data.short_data[0];
                            }
                            bVar41 = (byte)iVar25 & 0x3f;
                            iVar26 = iVar25 + 0x3f;
                            if (-1 < iVar25) {
                              iVar26 = iVar25;
                            }
                            (((value_type *)uVar21)->_data).short_data[iVar26 >> 6] =
                                 (((value_type *)uVar21)->_data).short_data[iVar26 >> 6] &
                                 (-2L << bVar41 | 0xfffffffffffffffeU >> 0x40 - bVar41);
                            SVOBitset::SVOBitset
                                      ((SVOBitset *)&p_gds,
                                       (SVOBitset *)
                                       ((ulong)(this->max_graphs * iVar25) * 0x88 +
                                       *(long *)&(((this->_imp)._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->target_graph_rows).
                                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                       ));
                            SVOBitset::operator&=
                                      ((SVOBitset *)&p_gds,
                                       (SVOBitset *)
                                       ((ulong)(this->max_graphs * (int)local_4c8) * 0x88 +
                                       *(long *)&(((this->_imp)._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->target_graph_rows).
                                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                       ));
                            named_n_t_w.
                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            named_n_t_w.
                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            named_n_t_w.
                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            uVar30 = (ulong)local_88;
                            pSVar19 = (SVOBitset *)&p_gds;
                            if (0x10 < uVar30) {
                              pSVar19 = (SVOBitset *)
                                        p_gds.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                            }
                            iVar26 = -1;
                            if (uVar30 != 0) {
                              lVar18 = 0;
                              do {
                                BVar34 = (pSVar19->_data).short_data[0];
                                if (BVar34 != 0) goto LAB_00132647;
                                lVar18 = lVar18 + -0x40;
                                pSVar19 = (SVOBitset *)((long)&pSVar19->_data + 8);
                              } while (uVar30 * 0x40 + lVar18 != 0);
                            }
LAB_00132587:
                            while (iVar26 != -1) {
                              pSVar19 = (SVOBitset *)&p_gds;
                              if (0x10 < local_88) {
                                pSVar19 = (SVOBitset *)
                                          p_gds.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                              }
                              bVar41 = (byte)iVar26 & 0x3f;
                              iVar33 = iVar26 + 0x3f;
                              if (-1 < iVar26) {
                                iVar33 = iVar26;
                              }
                              (pSVar19->_data).short_data[iVar33 >> 6] =
                                   (pSVar19->_data).short_data[iVar33 >> 6] &
                                   (-2L << bVar41 | 0xfffffffffffffffeU >> 0x40 - bVar41);
                              target_vertex_for_proof_abi_cxx11_(&named_p_1,this,iVar26);
                              std::
                              vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                              ::emplace_back<std::pair<int,std::__cxx11::string>>
                                        ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                          *)&named_n_t_w,&named_p_1);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)named_p_1.second._M_dataplus._M_p != &named_p_1.second.field_2)
                              {
                                operator_delete(named_p_1.second._M_dataplus._M_p,
                                                named_p_1.second.field_2._M_allocated_capacity + 1);
                              }
                              uVar30 = (ulong)local_88;
                              pSVar19 = (SVOBitset *)&p_gds;
                              if (0x10 < uVar30) {
                                pSVar19 = (SVOBitset *)
                                          p_gds.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                              }
                              iVar26 = -1;
                              if (uVar30 != 0) {
                                lVar18 = 0;
                                do {
                                  BVar34 = (pSVar19->_data).short_data[0];
                                  if (BVar34 != 0) goto LAB_00132647;
                                  lVar18 = lVar18 + -0x40;
                                  pSVar19 = (SVOBitset *)((long)&pSVar19->_data + 8);
                                } while (uVar30 * 0x40 + lVar18 != 0);
                              }
                            }
                            target_vertex_for_proof_abi_cxx11_(&named_p_1,this,iVar25);
                            std::
                            vector<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>>
                            ::
                            emplace_back<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>&>
                                      ((vector<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>>
                                        *)&named_two_away_from_t,&named_p_1,&named_n_t_w);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)named_p_1.second._M_dataplus._M_p != &named_p_1.second.field_2) {
                              operator_delete(named_p_1.second._M_dataplus._M_p,
                                              named_p_1.second.field_2._M_allocated_capacity + 1);
                            }
                            std::
                            vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::~vector(&named_n_t_w);
                            if ((0x10 < local_88) &&
                               (p_gds.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                              operator_delete__(p_gds.
                                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                            }
                            uVar30 = (ulong)n2_t.n_words;
                            uVar21 = &n2_t;
                            if (0x10 < uVar30) {
                              uVar21 = n2_t._data.short_data[0];
                            }
                            iVar25 = -1;
                            if (uVar30 != 0) {
                              lVar18 = 0;
                              do {
                                uVar29 = (((value_type *)uVar21)->_data).short_data[0];
                                if (uVar29 != 0) goto LAB_0013270f;
                                lVar18 = lVar18 + -0x40;
                                uVar21 = (long)&((value_type *)uVar21)->_data + 8;
                              } while (uVar30 * 0x40 + lVar18 != 0);
                            }
                          }
                          Proof::create_exact_path_graphs
                                    ((((this->_imp)._M_t.
                                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                       .
                                       super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                      ._M_head_impl)->proof).
                                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,(int)local_4d8,(NamedVertex *)&t_gds,
                                     (NamedVertex *)&n_p,&between_p_and_q,(NamedVertex *)&n_t,
                                     &named_n_t,&named_two_away_from_t,&named_d_n_t);
                          if ((0x10 < n2_t.n_words) && (n2_t._data.short_data[0] != 0)) {
                            operator_delete__(n2_t._data.long_data);
                          }
                          iVar25 = (int)local_4c8;
                          if ((0x10 < local_2d8) &&
                             (targets.
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                            operator_delete__(targets.
                                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if ((0x10 < local_178) &&
                             (patterns.
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                            operator_delete__(patterns.
                                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                          }
                          std::
                          vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                          ::~vector(&named_two_away_from_t);
                          std::
                          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::~vector(&named_d_n_t);
                          std::
                          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::~vector(&named_n_t);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish != &local_420) {
                            operator_delete(n_t.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_finish,
                                            (ulong)(local_420._0_8_ + 1));
                          }
                          uVar36 = iVar25 + 1;
                          if (this->target_size <= uVar36) break;
                        } while( true );
                      }
                      std::
                      vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~vector(&between_p_and_q);
                      if ((0x10 < np.n_words) && (np._data.short_data[0] != 0)) {
                        operator_delete__(np._data.long_data);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish != &aStack_460) {
                        operator_delete(n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish,
                                        (ulong)(aStack_460._0_8_ + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)t_gds.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish != &aStack_490) {
                        operator_delete(t_gds.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                                        aStack_490._0_8_ + 1);
                      }
                      uVar30 = local_4c0;
                      uVar36 = (uint)local_448;
                    }
                  }
                  uVar35 = (int)uVar30 + 1;
                  uVar30 = (ulong)uVar35;
                } while (uVar35 < this->pattern_size);
              }
              uVar36 = uVar36 + 1;
            } while (uVar36 < this->pattern_size);
          }
          bVar16 = (long)local_4d8 <
                   (long)*(int *)((long)((this->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         .
                                         super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                        ._M_head_impl)->params + 0x68);
          local_4d8 = local_4d8 + 1;
        } while (bVar16);
      }
    }
    bVar16 = supports_distance2_graphs
                       (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->params);
    if (bVar16) {
      _Var7._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      _build_exact_path_graphs
                (this,&(_Var7._M_head_impl)->pattern_graph_rows,this->pattern_size,
                 &next_pattern_supplemental,1,(_Var7._M_head_impl)->directed,true,true);
      _Var7._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      _build_exact_path_graphs
                (this,&(_Var7._M_head_impl)->target_graph_rows,this->target_size,
                 &next_target_supplemental,1,(_Var7._M_head_impl)->directed,true,false);
    }
    bVar16 = supports_distance3_graphs
                       (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->params);
    if (bVar16) {
      _build_distance3_graphs
                (this,&((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                       _M_head_impl)->pattern_graph_rows,this->pattern_size,
                 &next_pattern_supplemental,true);
      _build_distance3_graphs
                (this,&((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                       _M_head_impl)->target_graph_rows,this->target_size,&next_target_supplemental,
                 false);
      if ((*(long *)&(((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl)->proof).
                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0) &&
         (this->pattern_size != 0)) {
        uVar30 = 0;
        do {
          if (this->pattern_size != 0) {
            iVar26 = (int)uVar30;
            bVar41 = (byte)uVar30 & 0x3f;
            local_130 = -2L << bVar41 | 0xfffffffffffffffeU >> 0x40 - bVar41;
            iVar25 = iVar26 + 0x3f;
            if (-1 < iVar26) {
              iVar25 = iVar26;
            }
            local_138 = (long)(iVar25 >> 6);
            plVar27 = (long *)0x0;
            local_80 = uVar30;
            do {
              iVar26 = (int)local_80;
              pattern_vertex_for_proof_abi_cxx11_(&named_p_1,this,iVar26);
              iVar25 = (int)plVar27;
              pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&between_p_and_q,this,iVar25);
              local_440 = plVar27;
              if (iVar26 != iVar25) {
                _Var7._M_head_impl =
                     (this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                     .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                     _M_head_impl;
                uVar36 = this->max_graphs * (int)local_80;
                lVar18 = *(long *)&((_Var7._M_head_impl)->pattern_graph_rows).
                                   super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                ;
                lVar39 = (ulong)((next_pattern_supplemental - 1) + uVar36) * 0x88;
                if (*(uint *)(lVar18 + 0x80 + lVar39) < 0x11) {
                  lVar18 = lVar18 + lVar39;
                }
                else {
                  lVar18 = *(long *)(lVar18 + lVar39);
                }
                iVar26 = iVar25 + 0x3f;
                if (-1 < iVar25) {
                  iVar26 = iVar25;
                }
                uVar30 = (ulong)(iVar26 >> 6);
                if ((*(ulong *)(lVar18 + uVar30 * 8) >> ((ulong)plVar27 & 0x3f) & 1) != 0) {
                  local_f0[1]._0_1_ = '\0';
                  local_480 = '\0';
                  SVOBitset::SVOBitset
                            (&np,(SVOBitset *)
                                 ((ulong)uVar36 * 0x88 +
                                 *(long *)&((_Var7._M_head_impl)->pattern_graph_rows).
                                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                 ));
                  uVar21 = &np;
                  if (0x10 < np.n_words) {
                    uVar21 = np._data.short_data[0];
                  }
                  local_4c0 = 1L << ((ulong)plVar27 & 0x3f);
                  local_448 = (((SVOBitset *)uVar21)->_data).short_data[uVar30];
                  if ((local_448 & local_4c0) == 0) {
                    SVOBitset::SVOBitset
                              ((SVOBitset *)&patterns,
                               (SVOBitset *)
                               ((ulong)(this->max_graphs * (int)local_440) * 0x88 +
                               *(long *)&(((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           .
                                           super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                          ._M_head_impl)->pattern_graph_rows).
                                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                               ));
                    if ((ulong)np.n_words < 0x11) {
                      local_2d8 = np.n_words;
                      auVar51._8_8_ = np._data.short_data[1];
                      auVar51._0_8_ = np._data.short_data[0];
                      auVar51[0x10] = np._data.short_data[2]._0_1_;
                      auVar51._17_7_ = np._data.short_data[2]._1_7_;
                      auVar51._24_8_ = np._data.short_data[3];
                      auVar51._32_32_ = np._data._32_32_;
                      auVar51 = vmovdqu64_avx512f(auVar51);
                      auVar53 = vmovdqu64_avx512f(np._data._64_64_);
                      _targets = vmovdqu64_avx512f(auVar51);
                      unique0x00006d80 = vmovdqu64_avx512f(auVar53);
                    }
                    else {
                      local_2d8 = np.n_words;
                      uVar29 = (ulong)np.n_words << 3;
                      __dest = operator_new__(uVar29);
                      targets.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)__dest;
                      memmove(__dest,np._data.long_data,uVar29);
                    }
                    SVOBitset::operator&=((SVOBitset *)&targets,(SVOBitset *)&patterns);
                    uVar36 = local_2d8;
                    pSVar19 = (SVOBitset *)&targets;
                    if (0x10 < local_2d8) {
                      pSVar19 = (SVOBitset *)
                                targets.
                                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    }
                    (pSVar19->_data).short_data[local_138] =
                         (pSVar19->_data).short_data[local_138] & local_130;
                    ppVar20 = (pointer)&targets;
                    if (0x10 < uVar36) {
                      ppVar20 = targets.
                                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    }
                    local_4b0 = (long *)~local_4c0;
                    pppVar2 = &(((_Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&ppVar20->first)->_M_impl).super__Vector_impl_data._M_start +
                              uVar30;
                    *pppVar2 = (pointer)((ulong)*pppVar2 & (ulong)local_4b0);
                    bVar16 = SVOBitset::any((SVOBitset *)&targets);
                    if (!bVar16) {
                      uVar29 = (ulong)np.n_words;
                      uVar21 = &np;
                      if (0x10 < uVar29) {
                        uVar21 = np._data.short_data[0];
                      }
                      (((value_type *)uVar21)->_data).short_data[local_138] =
                           (((value_type *)uVar21)->_data).short_data[local_138] & local_130;
                      uVar21 = &np;
                      if (0x10 < uVar29) {
                        uVar21 = np._data.short_data[0];
                      }
                      (((value_type *)uVar21)->_data).short_data[uVar30] =
                           (((value_type *)uVar21)->_data).short_data[uVar30] & (ulong)local_4b0;
                      uVar21 = &np;
                      if (0x10 < uVar29) {
                        uVar21 = np._data.short_data[0];
                      }
                      iVar25 = -1;
                      local_4c8 = uVar30;
                      if (uVar29 != 0) {
                        lVar18 = 0;
                        do {
                          uVar30 = (((value_type *)uVar21)->_data).short_data[0];
                          if (uVar30 != 0) goto LAB_00133859;
                          lVar18 = lVar18 + -0x40;
                          uVar21 = (long)&((value_type *)uVar21)->_data + 8;
                        } while (uVar29 * 0x40 + lVar18 != 0);
                      }
LAB_00133579:
                      while ((iVar25 != -1 && (local_f0[1]._0_1_ == '\0'))) {
                        pvVar22 = &np;
                        if (0x10 < np.n_words) {
                          pvVar22 = (value_type *)np._data.short_data[0];
                        }
                        bVar41 = (byte)iVar25 & 0x3f;
                        uVar30 = -2L << bVar41 | 0xfffffffffffffffeU >> 0x40 - bVar41;
                        iVar26 = iVar25 + 0x3f;
                        if (-1 < iVar25) {
                          iVar26 = iVar25;
                        }
                        (pvVar22->_data).short_data[iVar26 >> 6] =
                             (pvVar22->_data).short_data[iVar26 >> 6] & uVar30;
                        SVOBitset::SVOBitset
                                  (&n2_t,(SVOBitset *)
                                         ((ulong)(this->max_graphs * iVar25) * 0x88 +
                                         *(long *)&(((this->_imp)._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->pattern_graph_rows).
                                                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                         ));
                        uVar29 = (ulong)n2_t.n_words;
                        uVar21 = &n2_t;
                        if (0x10 < uVar29) {
                          uVar21 = n2_t._data.short_data[0];
                        }
                        (((SVOBitset *)uVar21)->_data).short_data[iVar26 >> 6] =
                             (((SVOBitset *)uVar21)->_data).short_data[iVar26 >> 6] & uVar30;
                        uVar21 = &n2_t;
                        if (0x10 < uVar29) {
                          uVar21 = n2_t._data.short_data[0];
                        }
                        (((SVOBitset *)uVar21)->_data).short_data[local_138] =
                             (((SVOBitset *)uVar21)->_data).short_data[local_138] & local_130;
                        uVar21 = &n2_t;
                        if (0x10 < uVar29) {
                          uVar21 = n2_t._data.short_data[0];
                        }
                        (((SVOBitset *)uVar21)->_data).short_data[local_4c8] =
                             (((SVOBitset *)uVar21)->_data).short_data[local_4c8] & (ulong)local_4b0
                        ;
                        uVar21 = &n2_t;
                        if (0x10 < uVar29) {
                          uVar21 = n2_t._data.short_data[0];
                        }
                        iVar26 = -1;
                        if (uVar29 != 0) {
                          lVar18 = 0;
                          do {
                            BVar34 = (((SVOBitset *)uVar21)->_data).short_data[0];
                            if (BVar34 != 0) goto LAB_001337df;
                            lVar18 = lVar18 + -0x40;
                            uVar21 = (long)&((SVOBitset *)uVar21)->_data + 8;
                          } while (uVar29 * 0x40 + lVar18 != 0);
                        }
LAB_00133695:
                        while ((iVar26 != -1 && (local_f0[1]._0_1_ != '\x01'))) {
                          uVar21 = &n2_t;
                          if (0x10 < n2_t.n_words) {
                            uVar21 = n2_t._data.short_data[0];
                          }
                          bVar41 = (byte)iVar26 & 0x3f;
                          iVar33 = iVar26 + 0x3f;
                          if (-1 < iVar26) {
                            iVar33 = iVar26;
                          }
                          (((SVOBitset *)uVar21)->_data).short_data[iVar33 >> 6] =
                               (((SVOBitset *)uVar21)->_data).short_data[iVar33 >> 6] &
                               (-2L << bVar41 | 0xfffffffffffffffeU >> 0x40 - bVar41);
                          lVar18 = *(long *)&(((this->_imp)._M_t.
                                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               .
                                               super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                              ._M_head_impl)->pattern_graph_rows).
                                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                          ;
                          lVar39 = (ulong)(this->max_graphs * iVar26) * 0x88;
                          if (*(uint *)(lVar18 + 0x80 + lVar39) < 0x11) {
                            lVar18 = lVar18 + lVar39;
                          }
                          else {
                            lVar18 = *(long *)(lVar18 + lVar39);
                          }
                          if ((*(ulong *)(lVar18 + local_4c8 * 8) & local_4c0) != 0) {
                            pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&n_p,this,iVar25);
                            std::optional<std::pair<int,std::__cxx11::string>>::operator=
                                      ((optional<std::pair<int,std::__cxx11::string>> *)&p_gds,
                                       (NamedVertex *)&n_p);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish != &aStack_460) {
                              operator_delete(n_p.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_finish,
                                              (ulong)(aStack_460._0_8_ + 1));
                            }
                            pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&n_p,this,iVar26);
                            std::optional<std::pair<int,std::__cxx11::string>>::operator=
                                      ((optional<std::pair<int,std::__cxx11::string>> *)&t_gds,
                                       (NamedVertex *)&n_p);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish != &aStack_460) {
                              operator_delete(n_p.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_finish,
                                              (ulong)(aStack_460._0_8_ + 1));
                            }
                          }
                          uVar30 = (ulong)n2_t.n_words;
                          uVar21 = &n2_t;
                          if (0x10 < uVar30) {
                            uVar21 = n2_t._data.short_data[0];
                          }
                          iVar26 = -1;
                          if (uVar30 != 0) {
                            lVar18 = 0;
                            do {
                              BVar34 = (((SVOBitset *)uVar21)->_data).short_data[0];
                              if (BVar34 != 0) goto LAB_001337df;
                              lVar18 = lVar18 + -0x40;
                              uVar21 = (long)&((SVOBitset *)uVar21)->_data + 8;
                            } while (uVar30 * 0x40 + lVar18 != 0);
                          }
                        }
                        if ((0x10 < n2_t.n_words) && (n2_t._data.short_data[0] != 0)) {
                          operator_delete__(n2_t._data.long_data);
                        }
                        uVar29 = (ulong)np.n_words;
                        pvVar22 = &np;
                        if (0x10 < uVar29) {
                          pvVar22 = (value_type *)np._data.short_data[0];
                        }
                        iVar25 = -1;
                        if (uVar29 != 0) {
                          lVar18 = 0;
                          do {
                            uVar30 = (pvVar22->_data).short_data[0];
                            if (uVar30 != 0) goto LAB_00133859;
                            lVar18 = lVar18 + -0x40;
                            pvVar22 = (value_type *)((long)&pvVar22->_data + 8);
                          } while (uVar29 * 0x40 + lVar18 != 0);
                        }
                      }
                      goto LAB_00132d3d;
                    }
                    uVar30 = (ulong)local_2d8;
                    pSVar19 = (SVOBitset *)&targets;
                    if (0x10 < uVar30) {
                      pSVar19 = (SVOBitset *)
                                targets.
                                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    }
                    iVar25 = -1;
                    if (uVar30 == 0) goto LAB_00132cfd;
                    lVar18 = 0;
LAB_00132c30:
                    BVar34 = (pSVar19->_data).short_data[0];
                    if (BVar34 == 0) goto code_r0x00132c3d;
                    iVar25 = 0;
                    for (; (BVar34 & 1) == 0; BVar34 = BVar34 >> 1 | 0x8000000000000000) {
                      iVar25 = iVar25 + 1;
                    }
                    iVar25 = iVar25 - (int)lVar18;
LAB_00132cfd:
                    pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&n2_t,this,iVar25);
                    std::optional<std::pair<int,std::__cxx11::string>>::operator=
                              ((optional<std::pair<int,std::__cxx11::string>> *)&p_gds,
                               (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&n2_t);
                    if ((undefined1 *)n2_t._data.short_data[1] !=
                        (undefined1 *)((long)&n2_t._data + 0x18)) {
                      operator_delete((void *)n2_t._data.short_data[1],n2_t._data.short_data[3] + 1)
                      ;
                    }
LAB_00132d3d:
                    if (local_f0[1]._0_1_ == '\0') {
                      this_01 = (ProofError *)__cxa_allocate_exception(0x28);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&n_t,"Oops, there\'s a bug: missing path from ",
                                     &named_p_1.second);
                      pbVar23 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&n_t," to ");
                      n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)(pbVar23->_M_dataplus)._M_p;
                      paVar28 = &pbVar23->field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start == paVar28) {
                        n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage =
                             (pointer)paVar28->_M_allocated_capacity;
                        aStack_460._M_allocated_capacity = *(long *)((long)&pbVar23->field_2 + 8);
                        n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start =
                             (pointer)&n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage;
                      }
                      else {
                        n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage =
                             (pointer)paVar28->_M_allocated_capacity;
                      }
                      n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = (pointer)pbVar23->_M_string_length;
                      (pbVar23->_M_dataplus)._M_p = (pointer)paVar28;
                      pbVar23->_M_string_length = 0;
                      (pbVar23->field_2)._M_local_buf[0] = '\0';
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&n2_t,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&n_p,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&between_p_and_q.
                                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
                      ProofError::ProofError(this_01,(string *)&n2_t);
                      __cxa_throw(this_01,&ProofError::typeinfo,ProofError::~ProofError);
                    }
                    if ((0x10 < local_2d8) &&
                       (targets.
                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete__(targets.
                                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if ((0x10 < local_178) &&
                       (patterns.
                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete__(patterns.
                                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  if (this->target_size != 0) {
                    local_4b0 = (long *)CONCAT44(local_4b0._4_4_,next_pattern_supplemental - 1);
                    uVar30 = 0;
                    do {
                      iVar25 = (int)uVar30;
                      target_vertex_for_proof_abi_cxx11_((NamedVertex *)&named_n_t,this,iVar25);
                      named_two_away_from_t.
                      super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      named_two_away_from_t.
                      super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      named_two_away_from_t.
                      super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      named_n_t_w.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      named_n_t_w.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      named_n_t_w.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      d3_from_t.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      d3_from_t.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      d3_from_t.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_ = 0;
                      n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      aStack_460._M_allocated_capacity =
                           (size_type)
                           &n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                      local_450 = 0;
                      n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_ = 0;
                      n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      local_420._M_allocated_capacity =
                           (size_type)
                           &n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                      local_410 = 0;
                      aStack_460._8_8_ = aStack_460._M_allocated_capacity;
                      local_420._8_8_ = local_420._M_allocated_capacity;
                      SVOBitset::SVOBitset
                                ((SVOBitset *)&patterns,
                                 (SVOBitset *)
                                 ((ulong)(this->max_graphs * iVar25) * 0x88 +
                                 *(long *)&(((this->_imp)._M_t.
                                             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                             .
                                             super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                            ._M_head_impl)->target_graph_rows).
                                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                 ));
                      uVar29 = (ulong)local_178;
                      pSVar19 = (SVOBitset *)&patterns;
                      if (0x10 < uVar29) {
                        pSVar19 = (SVOBitset *)
                                  patterns.
                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      }
                      iVar26 = iVar25 + 0x3f;
                      if (-1 < iVar25) {
                        iVar26 = iVar25;
                      }
                      (pSVar19->_data).short_data[iVar26 >> 6] =
                           (pSVar19->_data).short_data[iVar26 >> 6] | 1L << (uVar30 & 0x3f);
                      pSVar19 = (SVOBitset *)&patterns;
                      if (0x10 < uVar29) {
                        pSVar19 = (SVOBitset *)
                                  patterns.
                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      }
                      uVar36 = 0xffffffff;
                      if (uVar29 != 0) {
                        lVar18 = 0;
                        do {
                          uVar30 = (pSVar19->_data).short_data[0];
                          if (uVar30 != 0) goto LAB_001332db;
                          lVar18 = lVar18 + -0x40;
                          pSVar19 = (SVOBitset *)((long)&pSVar19->_data + 8);
                        } while (uVar29 * 0x40 + lVar18 != 0);
                      }
LAB_00132ee0:
                      while( true ) {
                        if (uVar36 == 0xffffffff) break;
                        ppVar20 = (pointer)&patterns;
                        if (0x10 < local_178) {
                          ppVar20 = patterns.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                        uVar35 = uVar36 + 0x3f;
                        if (-1 < (int)uVar36) {
                          uVar35 = uVar36;
                        }
                        bVar41 = (byte)uVar36 & 0x3f;
                        local_4c8 = (ulong)((int)uVar35 >> 6);
                        pppVar2 = &(((_Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&ppVar20->first)->_M_impl).super__Vector_impl_data._M_start
                                  + local_4c8;
                        *pppVar2 = (pointer)((ulong)*pppVar2 &
                                            (-2L << bVar41 | 0xfffffffffffffffeU >> 0x40 - bVar41));
                        target_vertex_for_proof_abi_cxx11_((NamedVertex *)&targets,this,uVar36);
                        std::
                        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                        ::emplace_back<std::pair<int,std::__cxx11::string>>
                                  ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                    *)&named_two_away_from_t,(NamedVertex *)&targets);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)targets.
                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish != aaStack_340) {
                          operator_delete(targets.
                                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,
                                          aaStack_340[0]._M_allocated_capacity + 1);
                        }
                        SVOBitset::SVOBitset
                                  ((SVOBitset *)&targets,
                                   (SVOBitset *)
                                   ((ulong)(uVar36 * this->max_graphs) * 0x88 +
                                   *(long *)&(((this->_imp)._M_t.
                                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               .
                                               super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                              ._M_head_impl)->target_graph_rows).
                                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                   ));
                        uVar30 = (ulong)local_2d8;
                        pSVar19 = (SVOBitset *)&targets;
                        if (0x10 < uVar30) {
                          pSVar19 = (SVOBitset *)
                                    targets.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                        (pSVar19->_data).short_data[local_4c8] =
                             (pSVar19->_data).short_data[local_4c8] | 1L << ((ulong)uVar36 & 0x3f);
                        ppVar20 = (pointer)&targets;
                        if (0x10 < uVar30) {
                          ppVar20 = targets.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                        uVar36 = 0xffffffff;
                        if (uVar30 != 0) {
                          lVar18 = 0;
                          do {
                            uVar29 = *(ulong *)ppVar20;
                            if (uVar29 != 0) goto LAB_00133261;
                            lVar18 = lVar18 + -0x40;
                            ppVar20 = (pointer)&ppVar20->second;
                          } while (uVar30 * 0x40 + lVar18 != 0);
                        }
LAB_00133013:
                        while( true ) {
                          if (uVar36 == 0xffffffff) break;
                          ppVar20 = (pointer)&targets;
                          if (0x10 < local_2d8) {
                            ppVar20 = targets.
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                          }
                          uVar35 = uVar36 + 0x3f;
                          if (-1 < (int)uVar36) {
                            uVar35 = uVar36;
                          }
                          bVar41 = (byte)uVar36 & 0x3f;
                          pppVar2 = &(((_Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&ppVar20->first)->_M_impl).super__Vector_impl_data.
                                     _M_start + ((int)uVar35 >> 6);
                          *pppVar2 = (pointer)((ulong)*pppVar2 &
                                              (-2L << bVar41 | 0xfffffffffffffffeU >> 0x40 - bVar41)
                                              );
                          target_vertex_for_proof_abi_cxx11_((NamedVertex *)&n2_t,this,uVar36);
                          std::
                          _Rb_tree<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::_Identity<std::pair<int,std::__cxx11::string>>,std::less<std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<int,std::__cxx11::string>>>
                          ::_M_insert_unique<std::pair<int,std::__cxx11::string>>
                                    ((_Rb_tree<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::_Identity<std::pair<int,std::__cxx11::string>>,std::less<std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                      *)&n_p,(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&n2_t);
                          if ((undefined1 *)n2_t._data.short_data[1] !=
                              (undefined1 *)((long)&n2_t._data + 0x18)) {
                            operator_delete((void *)n2_t._data.short_data[1],
                                            n2_t._data.short_data[3] + 1);
                          }
                          SVOBitset::SVOBitset
                                    (&n2_t,(SVOBitset *)
                                           ((ulong)(uVar36 * this->max_graphs) * 0x88 +
                                           *(long *)&(((this->_imp)._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->target_graph_rows).
                                                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                           ));
                          uVar30 = (ulong)n2_t.n_words;
                          uVar21 = &n2_t;
                          if (0x10 < uVar30) {
                            uVar21 = n2_t._data.short_data[0];
                          }
                          (((SVOBitset *)uVar21)->_data).short_data[(int)uVar35 >> 6] =
                               (((SVOBitset *)uVar21)->_data).short_data[(int)uVar35 >> 6] |
                               1L << ((ulong)uVar36 & 0x3f);
                          uVar21 = &n2_t;
                          if (0x10 < uVar30) {
                            uVar21 = n2_t._data.short_data[0];
                          }
                          iVar26 = -1;
                          if (uVar30 != 0) {
                            lVar18 = 0;
                            do {
                              BVar34 = (((SVOBitset *)uVar21)->_data).short_data[0];
                              if (BVar34 != 0) goto LAB_001331e7;
                              lVar18 = lVar18 + -0x40;
                              uVar21 = (long)&((SVOBitset *)uVar21)->_data + 8;
                            } while (uVar30 * 0x40 + lVar18 != 0);
                          }
LAB_0013312f:
                          while (iVar26 != -1) {
                            uVar21 = &n2_t;
                            if (0x10 < n2_t.n_words) {
                              uVar21 = n2_t._data.short_data[0];
                            }
                            bVar41 = (byte)iVar26 & 0x3f;
                            iVar33 = iVar26 + 0x3f;
                            if (-1 < iVar26) {
                              iVar33 = iVar26;
                            }
                            (((SVOBitset *)uVar21)->_data).short_data[iVar33 >> 6] =
                                 (((SVOBitset *)uVar21)->_data).short_data[iVar33 >> 6] &
                                 (-2L << bVar41 | 0xfffffffffffffffeU >> 0x40 - bVar41);
                            target_vertex_for_proof_abi_cxx11_
                                      ((NamedVertex *)&named_d_n_t,this,iVar26);
                            std::
                            _Rb_tree<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::_Identity<std::pair<int,std::__cxx11::string>>,std::less<std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<int,std::__cxx11::string>>>
                            ::_M_insert_unique<std::pair<int,std::__cxx11::string>>
                                      ((_Rb_tree<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::_Identity<std::pair<int,std::__cxx11::string>>,std::less<std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                        *)&n_t,(NamedVertex *)&named_d_n_t);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)named_d_n_t.
                                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish != &local_40) {
                              operator_delete(named_d_n_t.
                                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish,
                                              local_40._M_allocated_capacity + 1);
                            }
                            uVar30 = (ulong)n2_t.n_words;
                            uVar21 = &n2_t;
                            if (0x10 < uVar30) {
                              uVar21 = n2_t._data.short_data[0];
                            }
                            iVar26 = -1;
                            if (uVar30 != 0) {
                              lVar18 = 0;
                              do {
                                BVar34 = (((SVOBitset *)uVar21)->_data).short_data[0];
                                if (BVar34 != 0) goto LAB_001331e7;
                                lVar18 = lVar18 + -0x40;
                                uVar21 = (long)&((SVOBitset *)uVar21)->_data + 8;
                              } while (uVar30 * 0x40 + lVar18 != 0);
                            }
                          }
                          if ((0x10 < n2_t.n_words) && (n2_t._data.short_data[0] != 0)) {
                            operator_delete__(n2_t._data.long_data);
                          }
                          uVar30 = (ulong)local_2d8;
                          ppVar20 = (pointer)&targets;
                          if (0x10 < uVar30) {
                            ppVar20 = targets.
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                          }
                          uVar36 = 0xffffffff;
                          if (uVar30 != 0) {
                            lVar18 = 0;
                            do {
                              uVar29 = *(ulong *)ppVar20;
                              if (uVar29 != 0) goto LAB_00133261;
                              lVar18 = lVar18 + -0x40;
                              ppVar20 = (pointer)&ppVar20->second;
                            } while (uVar30 * 0x40 + lVar18 != 0);
                          }
                        }
                        if ((0x10 < local_2d8) &&
                           (targets.
                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                          operator_delete__(targets.
                                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                        }
                        uVar29 = (ulong)local_178;
                        ppVar20 = (pointer)&patterns;
                        if (0x10 < uVar29) {
                          ppVar20 = patterns.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                        uVar36 = 0xffffffff;
                        if (uVar29 != 0) {
                          lVar18 = 0;
                          do {
                            uVar30 = *(ulong *)ppVar20;
                            if (uVar30 != 0) goto LAB_001332db;
                            lVar18 = lVar18 + -0x40;
                            ppVar20 = (pointer)&ppVar20->second;
                          } while (uVar29 * 0x40 + lVar18 != 0);
                        }
                      }
                      std::
                      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      ::
                      _M_assign_aux<std::_Rb_tree_const_iterator<std::pair<int,std::__cxx11::string>>>
                                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                  *)&named_n_t_w,aStack_460._0_8_,
                                 &n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish);
                      std::
                      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      ::
                      _M_assign_aux<std::_Rb_tree_const_iterator<std::pair<int,std::__cxx11::string>>>
                                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                  *)&d3_from_t,local_420._0_8_,
                                 &n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish);
                      if ((local_4c0 & local_448) == 0) {
                        pPVar11 = (((this->_imp)._M_t.
                                    super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                    .
                                    super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                   ._M_head_impl)->proof).
                                  super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr;
                        if (local_480 == '\x01') {
                          Proof::create_distance3_graphs
                                    (pPVar11,(int)local_4b0,&named_p_1,
                                     (NamedVertex *)&between_p_and_q,(NamedVertex *)&p_gds,
                                     (NamedVertex *)&t_gds,(NamedVertex *)&named_n_t,
                                     (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&named_two_away_from_t,&named_n_t_w,&d3_from_t);
                        }
                        else {
                          Proof::create_distance3_graphs_but_actually_distance_2
                                    (pPVar11,(int)local_4b0,&named_p_1,
                                     (NamedVertex *)&between_p_and_q,(NamedVertex *)&p_gds,
                                     (NamedVertex *)&named_n_t,
                                     (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&named_two_away_from_t,&named_n_t_w,&d3_from_t);
                        }
                      }
                      else {
                        Proof::create_distance3_graphs_but_actually_distance_1
                                  ((((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                     .
                                     super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                    ._M_head_impl)->proof).
                                   super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,(int)local_4b0,&named_p_1,(NamedVertex *)&between_p_and_q
                                   ,(NamedVertex *)&named_n_t,&d3_from_t);
                      }
                      if ((0x10 < local_178) &&
                         (patterns.
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                        operator_delete__(patterns.
                                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                      }
                      std::
                      _Rb_tree<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~_Rb_tree((_Rb_tree<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&n_t);
                      std::
                      _Rb_tree<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~_Rb_tree((_Rb_tree<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&n_p);
                      std::
                      vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~vector(&d3_from_t);
                      std::
                      vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~vector(&named_n_t_w);
                      std::
                      vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&named_two_away_from_t);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)named_n_t.
                             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish != &local_150) {
                        operator_delete(named_n_t.
                                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                                        local_150._0_8_ + 1);
                      }
                      uVar30 = (ulong)(iVar25 + 1U);
                      if (this->target_size <= iVar25 + 1U) break;
                    } while( true );
                  }
                  if ((0x10 < np.n_words) &&
                     ((value_type *)np._data.short_data[0] != (value_type *)0x0)) {
                    operator_delete__(np._data.long_data);
                  }
                  if (local_480 == '\x01') {
                    local_480 = '\0';
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)t_gds.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish != &aStack_490) {
                      operator_delete(t_gds.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      aStack_490._0_8_ + 1);
                    }
                  }
                  if (local_f0[1]._0_1_ == '\x01') {
                    local_f0[1]._0_1_ = '\0';
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)p_gds.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish != local_f0) {
                      operator_delete(p_gds.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      local_f0[0]._0_8_ + 1);
                    }
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)between_p_and_q.
                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish != &local_2b0) {
                operator_delete(between_p_and_q.
                                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                local_2b0._M_allocated_capacity + 1);
              }
              plVar27 = local_440;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)named_p_1.second._M_dataplus._M_p != &named_p_1.second.field_2) {
                operator_delete(named_p_1.second._M_dataplus._M_p,
                                named_p_1.second.field_2._M_allocated_capacity + 1);
              }
              uVar36 = (int)plVar27 + 1;
              plVar27 = (long *)(ulong)uVar36;
              uVar30 = local_80;
            } while (uVar36 < this->pattern_size);
          }
          uVar36 = (int)uVar30 + 1;
          uVar30 = (ulong)uVar36;
        } while (uVar36 < this->pattern_size);
      }
    }
    bVar16 = supports_k4_graphs(((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 .
                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                ._M_head_impl)->params);
    if (bVar16) {
      _build_k4_graphs(this,&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                             _M_head_impl)->pattern_graph_rows,this->pattern_size,
                       &next_pattern_supplemental,true);
      _build_k4_graphs(this,&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                             _M_head_impl)->target_graph_rows,this->target_size,
                       &next_target_supplemental,false);
    }
    lVar18 = (long)((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                   _M_head_impl)->params;
    plVar27 = *(long **)(lVar18 + 0x70);
    local_440 = (long *)(lVar18 + 0x70);
    if (plVar27 != local_440) {
      do {
        _build_extra_shape(this,&((this->_imp)._M_t.
                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                  .
                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                 ._M_head_impl)->pattern_graph_rows,this->pattern_size,
                           &next_pattern_supplemental,(InputGraph *)plVar27[3],
                           *(bool *)((long)plVar27 + 0x14),(int)plVar27[2],true);
        local_4b0 = plVar27;
        _build_extra_shape(this,&((this->_imp)._M_t.
                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                  .
                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                 ._M_head_impl)->target_graph_rows,this->target_size,
                           &next_target_supplemental,(InputGraph *)plVar27[3],
                           *(bool *)((long)plVar27 + 0x14),(int)plVar27[2],false);
        if ((*(long *)&(((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->proof).
                       super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0) &&
           (this->pattern_size != 0)) {
          local_4c8 = CONCAT44(local_4c8._4_4_,next_pattern_supplemental - 1);
          uVar36 = 0;
          do {
            if (this->pattern_size != 0) {
              uVar30 = 0;
              local_448 = CONCAT44(local_448._4_4_,uVar36);
              do {
                pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&patterns,this,uVar36);
                local_4c0 = uVar30;
                pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&targets,this,(int)uVar30);
                lVar18 = *(long *)&(((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                     .
                                     super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                    ._M_head_impl)->pattern_graph_rows).
                                   super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                ;
                lVar39 = (ulong)(this->max_graphs * uVar36 + (int)local_4c8) * 0x88;
                if (*(uint *)(lVar18 + 0x80 + lVar39) < 0x11) {
                  lVar18 = lVar18 + lVar39;
                }
                else {
                  lVar18 = *(long *)(lVar18 + lVar39);
                }
                iVar26 = (int)local_4c0;
                iVar25 = iVar26 + 0x3f;
                if (-1 < iVar26) {
                  iVar25 = iVar26;
                }
                if (((*(ulong *)(lVar18 + (long)(iVar25 >> 6) * 8) >> (local_4c0 & 0x3f) & 1) != 0)
                   && (this->target_size != 0)) {
                  uVar36 = 0;
                  do {
                    target_vertex_for_proof_abi_cxx11_((NamedVertex *)&n2_t,this,uVar36);
                    t_gds.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    t_gds.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    t_gds.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    SVOBitset::SVOBitset
                              (&np,(SVOBitset *)
                                   ((ulong)(this->max_graphs * uVar36 + (int)local_4c8) * 0x88 +
                                   *(long *)&(((this->_imp)._M_t.
                                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               .
                                               super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                              ._M_head_impl)->target_graph_rows).
                                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                   ));
                    uVar30 = local_4c0;
                    uVar29 = (ulong)np.n_words;
                    uVar21 = &np;
                    if (0x10 < uVar29) {
                      uVar21 = np._data.short_data[0];
                    }
                    iVar25 = -1;
                    if (uVar29 != 0) {
                      lVar18 = 0;
                      do {
                        BVar34 = (((SVOBitset *)uVar21)->_data).short_data[0];
                        if (BVar34 != 0) goto LAB_00133bab;
                        lVar18 = lVar18 + -0x40;
                        uVar21 = (long)&((SVOBitset *)uVar21)->_data + 8;
                      } while (uVar29 * 0x40 + lVar18 != 0);
                    }
LAB_00133ae9:
                    while( true ) {
                      iVar26 = (int)uVar30;
                      if (iVar25 == -1) break;
                      pvVar22 = &np;
                      if (0x10 < np.n_words) {
                        pvVar22 = (value_type *)np._data.short_data[0];
                      }
                      bVar41 = (byte)iVar25 & 0x3f;
                      iVar26 = iVar25 + 0x3f;
                      if (-1 < iVar25) {
                        iVar26 = iVar25;
                      }
                      (pvVar22->_data).short_data[iVar26 >> 6] =
                           (pvVar22->_data).short_data[iVar26 >> 6] &
                           (-2L << bVar41 | 0xfffffffffffffffeU >> 0x40 - bVar41);
                      target_vertex_for_proof_abi_cxx11_((NamedVertex *)&p_gds,this,iVar25);
                      std::
                      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      ::emplace_back<std::pair<int,std::__cxx11::string>>
                                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                  *)&t_gds,(NamedVertex *)&p_gds);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)p_gds.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish != local_f0) {
                        operator_delete(p_gds.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                                        local_f0[0]._0_8_ + 1);
                      }
                      uVar29 = (ulong)np.n_words;
                      pvVar22 = &np;
                      if (0x10 < uVar29) {
                        pvVar22 = (value_type *)np._data.short_data[0];
                      }
                      iVar25 = -1;
                      if (uVar29 != 0) {
                        lVar18 = 0;
                        do {
                          BVar34 = (pvVar22->_data).short_data[0];
                          if (BVar34 != 0) goto LAB_00133bab;
                          lVar18 = lVar18 + -0x40;
                          pvVar22 = (value_type *)((long)&pvVar22->_data + 8);
                        } while (uVar29 * 0x40 + lVar18 != 0);
                      }
                    }
                    Proof::hack_in_shape_graph
                              ((((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 .
                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                ._M_head_impl)->proof).
                               super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(int)local_4c8,(NamedVertex *)&patterns,
                               (NamedVertex *)&targets,(NamedVertex *)&n2_t,
                               (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&t_gds);
                    if ((0x10 < np.n_words) && (np._data.short_data[0] != 0)) {
                      operator_delete__(np._data.long_data);
                    }
                    std::
                    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&t_gds);
                    if ((undefined1 *)n2_t._data.short_data[1] !=
                        (undefined1 *)((long)&n2_t._data + 0x18)) {
                      operator_delete((void *)n2_t._data.short_data[1],n2_t._data.short_data[3] + 1)
                      ;
                    }
                    uVar36 = uVar36 + 1;
                    if (this->target_size <= uVar36) break;
                  } while( true );
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)targets.
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish != aaStack_340) {
                  operator_delete(targets.
                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  aaStack_340[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)patterns.
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish != aaStack_1e0) {
                  operator_delete(patterns.
                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  aaStack_1e0[0]._0_8_ + 1);
                }
                uVar30 = (ulong)(iVar26 + 1U);
                uVar36 = (uint)local_448;
              } while (iVar26 + 1U < this->pattern_size);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 < this->pattern_size);
        }
        plVar27 = (long *)*local_4b0;
      } while (plVar27 != local_440);
    }
    uVar35 = next_target_supplemental;
    uVar36 = next_pattern_supplemental;
    if (((next_pattern_supplemental != this->max_graphs) ||
        (next_target_supplemental != this->max_graphs)) ||
       (*(size_t *)
         ((long)&((this->_imp)._M_t.
                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl
                 )->supplemental_graph_names + 0x10) != (ulong)next_pattern_supplemental)) {
      this_00 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string((string *)&n_t,uVar36);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n_p,
                     "something has gone wrong with supplemental graph indexing: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n_t);
      pbVar23 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n_p," "
                      );
      t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(pbVar23->_M_dataplus)._M_p;
      paVar28 = &pbVar23->field_2;
      if (t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start == (pointer)paVar28) {
        t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)paVar28->_M_allocated_capacity;
        aStack_490._M_allocated_capacity = *(size_type *)((long)&pbVar23->field_2 + 8);
        t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start =
             (pointer)&t_gds.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)paVar28->_M_allocated_capacity;
      }
      t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pbVar23->_M_string_length;
      (pbVar23->_M_dataplus)._M_p = (pointer)paVar28;
      pbVar23->_M_string_length = 0;
      (pbVar23->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::to_string((string *)&named_p_1,uVar35);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_gds,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t_gds,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&named_p_1
                    );
      pbVar23 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_gds,
                       " ");
      n2_t._data.short_data[0] = (BitWord)(pbVar23->_M_dataplus)._M_p;
      paVar28 = &pbVar23->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)n2_t._data.short_data[0] == paVar28) {
        n2_t._data.short_data[2] = paVar28->_M_allocated_capacity;
        n2_t._data.short_data[3] = *(BitWord *)((long)&pbVar23->field_2 + 8);
        n2_t._data.short_data[0] = (BitWord)(BitWord *)((long)&n2_t._data + 0x10);
      }
      else {
        n2_t._data.short_data[2] = paVar28->_M_allocated_capacity;
      }
      n2_t._data.short_data[1] = pbVar23->_M_string_length;
      (pbVar23->_M_dataplus)._M_p = (pointer)paVar28;
      pbVar23->_M_string_length = 0;
      (pbVar23->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::to_string((string *)&between_p_and_q,this->max_graphs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n2_t,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &between_p_and_q);
      pbVar23 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ," ");
      patterns.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(pbVar23->_M_dataplus)._M_p;
      paVar28 = &pbVar23->field_2;
      if (patterns.
          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)paVar28) {
        patterns.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar28->_M_allocated_capacity
        ;
        aaStack_1e0[0]._0_8_ = *(BitWord *)((long)&pbVar23->field_2 + 8);
        patterns.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&patterns.
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        patterns.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar28->_M_allocated_capacity
        ;
      }
      patterns.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)pbVar23->_M_string_length;
      (pbVar23->_M_dataplus)._M_p = (pointer)paVar28;
      pbVar23->_M_string_length = 0;
      (pbVar23->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::to_string
                ((string *)&named_n_t,
                 *(size_t *)
                  ((long)&((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl)->supplemental_graph_names + 0x10));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&np,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&patterns,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&named_n_t
                    );
      UnsupportedConfiguration::UnsupportedConfiguration(this_00,(string *)&np);
      __cxa_throw(this_00,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if (1 < this->max_graphs) {
      uVar30 = 1;
      lVar18 = 0x18;
      do {
        _Var7._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        lVar39 = *(long *)&((_Var7._M_head_impl)->patterns_degrees).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ;
        uVar29 = ((long)*(pointer *)((long)&(_Var7._M_head_impl)->patterns_degrees + 8) - lVar39 >>
                 3) * -0x5555555555555555;
        if (uVar29 < uVar30 || uVar29 - uVar30 == 0) goto LAB_00134213;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)(lVar39 + lVar18),(ulong)this->pattern_size)
        ;
        _Var7._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        lVar39 = *(long *)&((_Var7._M_head_impl)->targets_degrees).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ;
        uVar29 = ((long)*(pointer *)((long)&(_Var7._M_head_impl)->targets_degrees + 8) - lVar39 >> 3
                 ) * -0x5555555555555555;
        if (uVar29 < uVar30 || uVar29 - uVar30 == 0) goto LAB_00134213;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)(lVar39 + lVar18),(ulong)this->target_size);
        uVar30 = uVar30 + 1;
        lVar18 = lVar18 + 0x18;
      } while ((uint)uVar30 < this->max_graphs);
    }
    uVar36 = this->max_graphs;
    if (1 < uVar36) {
      _Var7._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      uVar37 = 1;
      auVar51 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        if (this->pattern_size != 0) {
          lVar18 = *(long *)&((_Var7._M_head_impl)->pattern_graph_rows).
                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
          ;
          lVar39 = *(long *)&((_Var7._M_head_impl)->patterns_degrees).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ;
          uVar31 = ((long)*(pointer *)((long)&(_Var7._M_head_impl)->patterns_degrees + 8) - lVar39
                   >> 3) * -0x5555555555555555;
          plVar27 = (long *)(lVar39 + uVar37 * 0x18);
          uVar38 = 0;
          do {
            lVar39 = (ulong)(this->max_graphs * (int)uVar38 + (int)uVar37) * 0x88;
            uVar30 = (ulong)*(uint *)(lVar18 + 0x80 + lVar39);
            if (uVar30 < 0x11) {
              lVar39 = lVar39 + lVar18;
            }
            else {
              lVar39 = *(long *)(lVar18 + lVar39);
            }
            if (uVar30 == 0) {
              uVar32 = 0;
            }
            else {
              auVar52 = vpbroadcastq_avx512f();
              uVar29 = 0;
              auVar53 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar54 = auVar53;
                auVar53 = vpbroadcastq_avx512f();
                auVar53 = vporq_avx512f(auVar53,auVar51);
                uVar12 = vpcmpuq_avx512f(auVar53,auVar52,2);
                auVar53 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar39 + uVar29 * 8));
                auVar55._8_8_ = (ulong)((byte)(uVar12 >> 1) & 1) * auVar53._8_8_;
                auVar55._0_8_ = (ulong)((byte)uVar12 & 1) * auVar53._0_8_;
                auVar55._16_8_ = (ulong)((byte)(uVar12 >> 2) & 1) * auVar53._16_8_;
                auVar55._24_8_ = (ulong)((byte)(uVar12 >> 3) & 1) * auVar53._24_8_;
                auVar55._32_8_ = (ulong)((byte)(uVar12 >> 4) & 1) * auVar53._32_8_;
                auVar55._40_8_ = (ulong)((byte)(uVar12 >> 5) & 1) * auVar53._40_8_;
                auVar55._48_8_ = (ulong)((byte)(uVar12 >> 6) & 1) * auVar53._48_8_;
                auVar55._56_8_ = (uVar12 >> 7) * auVar53._56_8_;
                auVar53 = vpopcntq_avx512_vpopcntdq(auVar55);
                auVar46 = vpmovqd_avx512f(auVar53);
                auVar46 = vpaddd_avx2(auVar54._0_32_,auVar46);
                uVar29 = uVar29 + 8;
                auVar53 = ZEXT3264(auVar46);
              } while ((uVar30 + 7 & 0x1fffffff8) != uVar29);
              auVar46 = vmovdqa32_avx512vl(auVar46);
              bVar16 = (bool)((byte)uVar12 & 1);
              auVar44._0_4_ = (uint)bVar16 * auVar46._0_4_ | (uint)!bVar16 * auVar54._0_4_;
              bVar16 = (bool)((byte)(uVar12 >> 1) & 1);
              auVar44._4_4_ = (uint)bVar16 * auVar46._4_4_ | (uint)!bVar16 * auVar54._4_4_;
              bVar16 = (bool)((byte)(uVar12 >> 2) & 1);
              auVar44._8_4_ = (uint)bVar16 * auVar46._8_4_ | (uint)!bVar16 * auVar54._8_4_;
              bVar16 = (bool)((byte)(uVar12 >> 3) & 1);
              auVar44._12_4_ = (uint)bVar16 * auVar46._12_4_ | (uint)!bVar16 * auVar54._12_4_;
              bVar16 = (bool)((byte)(uVar12 >> 4) & 1);
              auVar49._16_4_ = (uint)bVar16 * auVar46._16_4_ | (uint)!bVar16 * auVar54._16_4_;
              auVar49._0_16_ = auVar44;
              bVar16 = (bool)((byte)(uVar12 >> 5) & 1);
              auVar49._20_4_ = (uint)bVar16 * auVar46._20_4_ | (uint)!bVar16 * auVar54._20_4_;
              bVar16 = (bool)((byte)(uVar12 >> 6) & 1);
              auVar49._24_4_ = (uint)bVar16 * auVar46._24_4_ | (uint)!bVar16 * auVar54._24_4_;
              bVar16 = SUB81(uVar12 >> 7,0);
              auVar49._28_4_ = (uint)bVar16 * auVar46._28_4_ | (uint)!bVar16 * auVar54._28_4_;
              auVar42 = vphaddd_avx(auVar49._16_16_,auVar44);
              auVar42 = vphaddd_avx(auVar42,auVar42);
              auVar42 = vphaddd_avx(auVar42,auVar42);
              uVar32 = auVar42._0_4_;
            }
            uVar29 = uVar31;
            uVar30 = uVar37;
            if (uVar31 < uVar37 || uVar31 - uVar37 == 0) goto LAB_00134213;
            lVar39 = *plVar27;
            uVar29 = plVar27[1] - lVar39 >> 2;
            uVar30 = uVar38;
            if (uVar29 <= uVar38) goto LAB_00134213;
            *(undefined4 *)(lVar39 + uVar38 * 4) = uVar32;
            uVar36 = (int)uVar38 + 1;
            uVar38 = (ulong)uVar36;
          } while (uVar36 < this->pattern_size);
        }
        if (this->target_size != 0) {
          lVar18 = *(long *)&((_Var7._M_head_impl)->target_graph_rows).
                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
          ;
          lVar39 = *(long *)&((_Var7._M_head_impl)->targets_degrees).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ;
          uVar31 = ((long)*(pointer *)((long)&(_Var7._M_head_impl)->targets_degrees + 8) - lVar39 >>
                   3) * -0x5555555555555555;
          plVar27 = (long *)(lVar39 + uVar37 * 0x18);
          uVar38 = 0;
          do {
            lVar39 = (ulong)(this->max_graphs * (int)uVar38 + (int)uVar37) * 0x88;
            uVar30 = (ulong)*(uint *)(lVar18 + 0x80 + lVar39);
            if (uVar30 < 0x11) {
              lVar39 = lVar39 + lVar18;
            }
            else {
              lVar39 = *(long *)(lVar18 + lVar39);
            }
            if (uVar30 == 0) {
              uVar32 = 0;
            }
            else {
              auVar52 = vpbroadcastq_avx512f();
              uVar29 = 0;
              auVar53 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar54 = auVar53;
                auVar53 = vpbroadcastq_avx512f();
                auVar53 = vporq_avx512f(auVar53,auVar51);
                uVar12 = vpcmpuq_avx512f(auVar53,auVar52,2);
                auVar53 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar39 + uVar29 * 8));
                auVar56._8_8_ = (ulong)((byte)(uVar12 >> 1) & 1) * auVar53._8_8_;
                auVar56._0_8_ = (ulong)((byte)uVar12 & 1) * auVar53._0_8_;
                auVar56._16_8_ = (ulong)((byte)(uVar12 >> 2) & 1) * auVar53._16_8_;
                auVar56._24_8_ = (ulong)((byte)(uVar12 >> 3) & 1) * auVar53._24_8_;
                auVar56._32_8_ = (ulong)((byte)(uVar12 >> 4) & 1) * auVar53._32_8_;
                auVar56._40_8_ = (ulong)((byte)(uVar12 >> 5) & 1) * auVar53._40_8_;
                auVar56._48_8_ = (ulong)((byte)(uVar12 >> 6) & 1) * auVar53._48_8_;
                auVar56._56_8_ = (uVar12 >> 7) * auVar53._56_8_;
                auVar53 = vpopcntq_avx512_vpopcntdq(auVar56);
                auVar46 = vpmovqd_avx512f(auVar53);
                auVar46 = vpaddd_avx2(auVar54._0_32_,auVar46);
                uVar29 = uVar29 + 8;
                auVar53 = ZEXT3264(auVar46);
              } while ((uVar30 + 7 & 0x1fffffff8) != uVar29);
              auVar46 = vmovdqa32_avx512vl(auVar46);
              bVar16 = (bool)((byte)uVar12 & 1);
              auVar45._0_4_ = (uint)bVar16 * auVar46._0_4_ | (uint)!bVar16 * auVar54._0_4_;
              bVar16 = (bool)((byte)(uVar12 >> 1) & 1);
              auVar45._4_4_ = (uint)bVar16 * auVar46._4_4_ | (uint)!bVar16 * auVar54._4_4_;
              bVar16 = (bool)((byte)(uVar12 >> 2) & 1);
              auVar45._8_4_ = (uint)bVar16 * auVar46._8_4_ | (uint)!bVar16 * auVar54._8_4_;
              bVar16 = (bool)((byte)(uVar12 >> 3) & 1);
              auVar45._12_4_ = (uint)bVar16 * auVar46._12_4_ | (uint)!bVar16 * auVar54._12_4_;
              bVar16 = (bool)((byte)(uVar12 >> 4) & 1);
              auVar50._16_4_ = (uint)bVar16 * auVar46._16_4_ | (uint)!bVar16 * auVar54._16_4_;
              auVar50._0_16_ = auVar45;
              bVar16 = (bool)((byte)(uVar12 >> 5) & 1);
              auVar50._20_4_ = (uint)bVar16 * auVar46._20_4_ | (uint)!bVar16 * auVar54._20_4_;
              bVar16 = (bool)((byte)(uVar12 >> 6) & 1);
              auVar50._24_4_ = (uint)bVar16 * auVar46._24_4_ | (uint)!bVar16 * auVar54._24_4_;
              bVar16 = SUB81(uVar12 >> 7,0);
              auVar50._28_4_ = (uint)bVar16 * auVar46._28_4_ | (uint)!bVar16 * auVar54._28_4_;
              auVar42 = vphaddd_avx(auVar50._16_16_,auVar45);
              auVar42 = vphaddd_avx(auVar42,auVar42);
              auVar42 = vphaddd_avx(auVar42,auVar42);
              uVar32 = auVar42._0_4_;
            }
            uVar29 = uVar31;
            uVar30 = uVar37;
            if (uVar31 < uVar37 || uVar31 - uVar37 == 0) goto LAB_00134213;
            lVar39 = *plVar27;
            uVar29 = plVar27[1] - lVar39 >> 2;
            uVar30 = uVar38;
            if (uVar29 <= uVar38) goto LAB_00134213;
            *(undefined4 *)(lVar39 + uVar38 * 4) = uVar32;
            uVar36 = (int)uVar38 + 1;
            uVar38 = (ulong)uVar36;
          } while (uVar36 < this->target_size);
        }
        uVar37 = uVar37 + 1;
        uVar36 = this->max_graphs;
      } while (uVar37 < uVar36);
    }
    uVar30 = (ulong)this->target_size;
    if (uVar30 != 0) {
      _Var7._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      lVar18 = **(long **)&((_Var7._M_head_impl)->targets_degrees).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ;
      iVar25 = (_Var7._M_head_impl)->largest_target_degree;
      uVar29 = 0;
      do {
        iVar26 = *(int *)(lVar18 + uVar29 * 4);
        if (iVar25 <= iVar26) {
          iVar25 = iVar26;
        }
        (_Var7._M_head_impl)->largest_target_degree = iVar25;
        uVar29 = uVar29 + 1;
      } while (uVar30 != uVar29);
    }
    uVar35 = this->pattern_size;
    if ((ulong)uVar35 != 0) {
      _Var7._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      lVar18 = *(long *)&((_Var7._M_head_impl)->pattern_loops).
                         super__Vector_base<int,_std::allocator<int>_>;
      uVar29 = 0;
      uVar37 = 0;
      do {
        if (*(int *)(lVar18 + uVar37 * 4) != 0) {
          lVar39 = *(long *)&((_Var7._M_head_impl)->pattern_graph_rows).
                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
          ;
          lVar13 = uVar29 * 0x88;
          if (*(uint *)(lVar39 + 0x80 + lVar13) < 0x11) {
            lVar39 = lVar39 + lVar13;
          }
          else {
            lVar39 = *(long *)(lVar39 + lVar13);
          }
          iVar25 = (int)uVar37;
          iVar26 = iVar25 + 0x3f;
          if (-1 < iVar25) {
            iVar26 = iVar25;
          }
          puVar3 = (ulong *)(lVar39 + (long)(iVar26 >> 6) * 8);
          *puVar3 = *puVar3 | 1L << (uVar37 & 0x3f);
        }
        uVar37 = uVar37 + 1;
        uVar29 = (ulong)((int)uVar29 + uVar36);
      } while (uVar35 != uVar37);
    }
    if (uVar30 != 0) {
      _Var7._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      lVar18 = *(long *)&((_Var7._M_head_impl)->target_loops).
                         super__Vector_base<int,_std::allocator<int>_>;
      uVar29 = 0;
      uVar37 = 0;
      do {
        if (*(int *)(lVar18 + uVar37 * 4) != 0) {
          lVar39 = *(long *)&((_Var7._M_head_impl)->target_graph_rows).
                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
          ;
          lVar13 = uVar29 * 0x88;
          if (*(uint *)(lVar39 + 0x80 + lVar13) < 0x11) {
            lVar39 = lVar39 + lVar13;
          }
          else {
            lVar39 = *(long *)(lVar39 + lVar13);
          }
          iVar25 = (int)uVar37;
          iVar26 = iVar25 + 0x3f;
          if (-1 < iVar25) {
            iVar26 = iVar25;
          }
          puVar3 = (ulong *)(lVar39 + (long)(iVar26 >> 6) * 8);
          *puVar3 = *puVar3 | 1L << (uVar37 & 0x3f);
        }
        uVar37 = uVar37 + 1;
        uVar29 = (ulong)((int)uVar29 + uVar36);
      } while (uVar30 != uVar37);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
                ->pattern_adjacencies_bits,(ulong)(uVar35 * uVar35));
    if (this->max_graphs != 0) {
      uVar36 = 0;
      do {
        if (this->pattern_size != 0) {
          uVar35 = 0;
          do {
            uVar24 = this->pattern_size;
            if (uVar24 != 0) {
              uVar30 = 0;
              do {
                _Var7._M_head_impl =
                     (this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                     .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                     _M_head_impl;
                lVar18 = *(long *)&((_Var7._M_head_impl)->pattern_graph_rows).
                                   super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                ;
                lVar39 = (ulong)(this->max_graphs * uVar35 + uVar36) * 0x88;
                if (*(uint *)(lVar18 + 0x80 + lVar39) < 0x11) {
                  lVar18 = lVar18 + lVar39;
                }
                else {
                  lVar18 = *(long *)(lVar18 + lVar39);
                }
                iVar25 = (int)uVar30;
                iVar26 = iVar25 + 0x3f;
                if (-1 < iVar25) {
                  iVar26 = iVar25;
                }
                if ((*(ulong *)(lVar18 + (long)(iVar26 >> 6) * 8) >> (uVar30 & 0x3f) & 1) != 0) {
                  pbVar4 = (byte *)(*(long *)&((_Var7._M_head_impl)->pattern_adjacencies_bits).
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   + (ulong)(uVar24 * uVar35 + iVar25));
                  *pbVar4 = *pbVar4 | (byte)(1 << (uVar36 & 0x1f));
                }
                uVar30 = (ulong)(iVar25 + 1U);
                uVar24 = this->pattern_size;
              } while (iVar25 + 1U < uVar24);
            }
            uVar35 = uVar35 + 1;
          } while (uVar35 < this->pattern_size);
        }
        uVar36 = uVar36 + 1;
      } while (uVar36 < this->max_graphs);
    }
    bVar16 = true;
  }
  return bVar16;
LAB_00131b02:
  iVar25 = 0;
  for (; (BVar34 & 1) == 0; BVar34 = BVar34 >> 1 | 0x8000000000000000) {
    iVar25 = iVar25 + 1;
  }
  iVar25 = iVar25 - (int)lVar18;
  goto LAB_00131a4b;
LAB_00132125:
  iVar25 = 0;
  for (; (BVar34 & 1) == 0; BVar34 = BVar34 >> 1 | 0x8000000000000000) {
    iVar25 = iVar25 + 1;
  }
  iVar25 = iVar25 - (int)lVar18;
  goto LAB_00132026;
code_r0x001321eb:
  lVar18 = lVar18 + -0x40;
  pSVar19 = (SVOBitset *)((long)&pSVar19->_data + 8);
  if (uVar30 * 0x40 + lVar18 == 0) goto joined_r0x00132212;
  goto LAB_001321e3;
LAB_0013242b:
  iVar25 = 0;
  for (; (BVar34 & 1) == 0; BVar34 = BVar34 >> 1 | 0x8000000000000000) {
    iVar25 = iVar25 + 1;
  }
  iVar25 = iVar25 - (int)lVar18;
  goto LAB_00132360;
LAB_00132647:
  iVar26 = 0;
  for (; (BVar34 & 1) == 0; BVar34 = BVar34 >> 1 | 0x8000000000000000) {
    iVar26 = iVar26 + 1;
  }
  iVar26 = iVar26 - (int)lVar18;
  goto LAB_00132587;
LAB_0013270f:
  iVar25 = 0;
  for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    iVar25 = iVar25 + 1;
  }
  iVar25 = iVar25 - (int)lVar18;
  goto LAB_001324a6;
LAB_001337df:
  iVar26 = 0;
  for (; (BVar34 & 1) == 0; BVar34 = BVar34 >> 1 | 0x8000000000000000) {
    iVar26 = iVar26 + 1;
  }
  iVar26 = iVar26 - (int)lVar18;
  goto LAB_00133695;
LAB_00133859:
  iVar25 = 0;
  for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
    iVar25 = iVar25 + 1;
  }
  iVar25 = iVar25 - (int)lVar18;
  goto LAB_00133579;
code_r0x00132c3d:
  lVar18 = lVar18 + -0x40;
  pSVar19 = (SVOBitset *)((long)&pSVar19->_data + 8);
  if (uVar30 * 0x40 + lVar18 == 0) goto LAB_00132cfd;
  goto LAB_00132c30;
LAB_001332db:
  iVar26 = 0;
  for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
    iVar26 = iVar26 + 1;
  }
  uVar36 = iVar26 - (int)lVar18;
  goto LAB_00132ee0;
LAB_001331e7:
  iVar26 = 0;
  for (; (BVar34 & 1) == 0; BVar34 = BVar34 >> 1 | 0x8000000000000000) {
    iVar26 = iVar26 + 1;
  }
  iVar26 = iVar26 - (int)lVar18;
  goto LAB_0013312f;
LAB_00133261:
  iVar26 = 0;
  for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    iVar26 = iVar26 + 1;
  }
  uVar36 = iVar26 - (int)lVar18;
  goto LAB_00133013;
LAB_00133bab:
  iVar25 = 0;
  for (; (BVar34 & 1) == 0; BVar34 = BVar34 >> 1 | 0x8000000000000000) {
    iVar25 = iVar25 + 1;
  }
  iVar25 = iVar25 - (int)lVar18;
  goto LAB_00133ae9;
}

Assistant:

auto HomomorphismModel::prepare() -> bool
{
    if (is_nonshrinking(_imp->params) && (pattern_size > target_size))
        return false;

    _imp->supplemental_graph_names.push_back("original");

    // pattern and target degrees, for the main graph
    _imp->patterns_degrees.at(0).resize(pattern_size);
    _imp->targets_degrees.at(0).resize(target_size);

    for (unsigned i = 0; i < pattern_size; ++i)
        _imp->patterns_degrees.at(0).at(i) = _imp->pattern_graph_rows[i * max_graphs + 0].count();

    for (unsigned i = 0; i < target_size; ++i)
        _imp->targets_degrees.at(0).at(i) = _imp->target_graph_rows[i * max_graphs + 0].count();

    if (global_degree_is_preserved(_imp->params)) {
        vector<pair<int, int>> p_gds, t_gds;
        for (unsigned i = 0; i < pattern_size; ++i)
            p_gds.emplace_back(i, _imp->patterns_degrees.at(0).at(i));
        for (unsigned i = 0; i < target_size; ++i)
            t_gds.emplace_back(i, _imp->targets_degrees.at(0).at(i));

        sort(p_gds.begin(), p_gds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });
        sort(t_gds.begin(), t_gds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });

        for (unsigned i = 0; i < p_gds.size(); ++i)
            if (p_gds.at(i).second > t_gds.at(i).second) {
                if (_imp->proof) {
                    for (unsigned p = 0; p <= i; ++p) {
                        vector<int> n_p;
                        auto np = _imp->pattern_graph_rows[p_gds.at(p).first * max_graphs + 0];
                        for (unsigned j = 0; j < pattern_size; ++j)
                            if (np.test(j))
                                n_p.push_back(j);

                        for (unsigned t = i; t < t_gds.size(); ++t) {
                            vector<int> n_t;
                            auto nt = _imp->target_graph_rows[t_gds.at(t).first * max_graphs + 0];
                            for (auto j = nt.find_first(); j != decltype(nt)::npos; j = nt.find_first()) {
                                nt.reset(j);
                                n_t.push_back(j);
                            }

                            _imp->proof->incompatible_by_degrees(0,
                                pattern_vertex_for_proof(p_gds.at(p).first), n_p,
                                target_vertex_for_proof(t_gds.at(t).first), n_t);
                        }
                    }

                    vector<NamedVertex> patterns, targets;
                    for (unsigned p = 0; p <= i; ++p)
                        patterns.push_back(pattern_vertex_for_proof(p_gds.at(p).first));
                    for (unsigned t = 0; t < i; ++t)
                        targets.push_back(target_vertex_for_proof(t_gds.at(t).first));

                    _imp->proof->emit_hall_set_or_violator(patterns, targets);
                }
                return false;
            }
    }

    unsigned next_pattern_supplemental = 1, next_target_supplemental = 1;
    // build exact path graphs
    if (supports_exact_path_graphs(_imp->params)) {
        _build_exact_path_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, _imp->params.number_of_exact_path_graphs, _imp->directed, false, true);
        _build_exact_path_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, _imp->params.number_of_exact_path_graphs, _imp->directed, false, false);

        if (_imp->proof) {
            for (int g = 1; g <= _imp->params.number_of_exact_path_graphs; ++g) {
                for (unsigned p = 0; p < pattern_size; ++p) {
                    for (unsigned q = 0; q < pattern_size; ++q) {
                        if (p == q || ! _imp->pattern_graph_rows[p * max_graphs + g].test(q))
                            continue;

                        auto named_p = pattern_vertex_for_proof(p);
                        auto named_q = pattern_vertex_for_proof(q);

                        auto n_p_q = _imp->pattern_graph_rows[p * max_graphs + 0];
                        n_p_q &= _imp->pattern_graph_rows[q * max_graphs + 0];
                        vector<NamedVertex> between_p_and_q;
                        for (auto v = n_p_q.find_first(); v != decltype(n_p_q)::npos; v = n_p_q.find_first()) {
                            n_p_q.reset(v);
                            between_p_and_q.push_back(pattern_vertex_for_proof(v));
                            if (between_p_and_q.size() >= unsigned(g))
                                break;
                        }

                        for (unsigned t = 0; t < target_size; ++t) {
                            auto named_t = target_vertex_for_proof(t);

                            vector<NamedVertex> named_n_t, named_d_n_t;
                            vector<pair<NamedVertex, vector<NamedVertex>>> named_two_away_from_t;
                            auto n_t = _imp->target_graph_rows[t * max_graphs + 0];
                            for (auto w = n_t.find_first(); w != decltype(n_t)::npos; w = n_t.find_first()) {
                                n_t.reset(w);
                                named_n_t.push_back(target_vertex_for_proof(w));
                            }

                            auto nd_t = _imp->target_graph_rows[t * max_graphs + g];
                            for (auto w = nd_t.find_first(); w != decltype(nd_t)::npos; w = nd_t.find_first()) {
                                nd_t.reset(w);
                                named_d_n_t.push_back(target_vertex_for_proof(w));
                            }

                            auto n2_t = _imp->target_graph_rows[t * max_graphs + 1];
                            for (auto w = n2_t.find_first(); w != decltype(n2_t)::npos; w = n2_t.find_first()) {
                                n2_t.reset(w);
                                auto n_t_w = _imp->target_graph_rows[w * max_graphs + 0];
                                n_t_w &= _imp->target_graph_rows[t * max_graphs + 0];
                                vector<NamedVertex> named_n_t_w;
                                for (auto x = n_t_w.find_first(); x != decltype(n_t_w)::npos; x = n_t_w.find_first()) {
                                    n_t_w.reset(x);
                                    named_n_t_w.push_back(target_vertex_for_proof(x));
                                }
                                named_two_away_from_t.emplace_back(target_vertex_for_proof(w), named_n_t_w);
                            }

                            _imp->proof->create_exact_path_graphs(g, named_p, named_q, between_p_and_q,
                                named_t, named_n_t, named_two_away_from_t, named_d_n_t);
                        }
                    }
                }
            }
        }
    }

    if (supports_distance2_graphs(_imp->params)) {
        _build_exact_path_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, 1, _imp->directed, true, true);
        _build_exact_path_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, 1, _imp->directed, true, false);
    }

    if (supports_distance3_graphs(_imp->params)) {
        _build_distance3_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, true);
        _build_distance3_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, false);

        if (_imp->proof) {
            for (unsigned p = 0; p < pattern_size; ++p) {
                for (unsigned q = 0; q < pattern_size; ++q) {
                    auto named_p = pattern_vertex_for_proof(p);
                    auto named_q = pattern_vertex_for_proof(q);

                    // only do this if they're actually adjacent
                    if (p == q || ! _imp->pattern_graph_rows[p * max_graphs + next_pattern_supplemental - 1].test(q))
                        continue;

                    bool actually_adjacent = false;
                    optional<NamedVertex> path_from_p_to_q_1 = nullopt, path_from_p_to_q_2 = nullopt;

                    auto n_p = _imp->pattern_graph_rows[p * max_graphs + 0];

                    // are they actually distance 1 apart?
                    if (n_p.test(q))
                        actually_adjacent = true;
                    else {
                        auto n_q = _imp->pattern_graph_rows[q * max_graphs + 0];

                        auto n_p_q = n_p;
                        n_p_q &= n_q;
                        n_p_q.reset(p);
                        n_p_q.reset(q);

                        if (n_p_q.any()) {
                            // they're actually distance 2 apart
                            path_from_p_to_q_1 = pattern_vertex_for_proof(n_p_q.find_first());
                        }
                        else {
                            // find a path of length 3
                            n_p.reset(p);
                            n_p.reset(q);
                            for (auto v = n_p.find_first(); v != decltype(n_p)::npos && ! path_from_p_to_q_1; v = n_p.find_first()) {
                                n_p.reset(v);
                                auto n_v = _imp->pattern_graph_rows[v * max_graphs + 0];
                                n_v.reset(v);
                                n_v.reset(p);
                                n_v.reset(q);
                                for (auto w = n_v.find_first(); w != decltype(n_v)::npos && ! path_from_p_to_q_1; w = n_v.find_first()) {
                                    n_v.reset(w);
                                    if (_imp->pattern_graph_rows[w * max_graphs + 0].test(q)) {
                                        path_from_p_to_q_1 = pattern_vertex_for_proof(v);
                                        path_from_p_to_q_2 = pattern_vertex_for_proof(w);
                                    }
                                }
                            }
                        }

                        if (! path_from_p_to_q_1)
                            throw ProofError{"Oops, there's a bug: missing path from " + named_p.second + " to " + named_q.second};
                    }

                    for (unsigned t = 0; t < target_size; ++t) {
                        auto named_t = target_vertex_for_proof(t);

                        vector<NamedVertex> d1_from_t, d2_from_t, d3_from_t;
                        set<NamedVertex> d2_from_t_set, d3_from_t_set;
                        auto n_t = _imp->target_graph_rows[t * max_graphs + 0];
                        n_t.set(t);
                        for (auto v = n_t.find_first(); v != decltype(n_t)::npos; v = n_t.find_first()) {
                            n_t.reset(v);
                            d1_from_t.push_back(target_vertex_for_proof(v));
                            auto n_v = _imp->target_graph_rows[v * max_graphs + 0];
                            n_v.set(v);
                            for (auto w = n_v.find_first(); w != decltype(n_v)::npos; w = n_v.find_first()) {
                                n_v.reset(w);
                                d2_from_t_set.insert(target_vertex_for_proof(w));
                                auto n_w = _imp->target_graph_rows[w * max_graphs + 0];
                                n_w.set(w);
                                for (auto x = n_w.find_first(); x != decltype(n_w)::npos; x = n_w.find_first()) {
                                    n_w.reset(x);
                                    d3_from_t_set.insert(target_vertex_for_proof(x));
                                }
                            }
                        }

                        d2_from_t.assign(d2_from_t_set.begin(), d2_from_t_set.end());
                        d3_from_t.assign(d3_from_t_set.begin(), d3_from_t_set.end());

                        if (actually_adjacent)
                            _imp->proof->create_distance3_graphs_but_actually_distance_1(next_pattern_supplemental - 1, named_p, named_q, named_t, d3_from_t);
                        else if (path_from_p_to_q_2)
                            _imp->proof->create_distance3_graphs(next_pattern_supplemental - 1, named_p, named_q, *path_from_p_to_q_1,
                                *path_from_p_to_q_2, named_t, d1_from_t, d2_from_t, d3_from_t);
                        else
                            _imp->proof->create_distance3_graphs_but_actually_distance_2(next_pattern_supplemental - 1, named_p, named_q, *path_from_p_to_q_1,
                                named_t, d1_from_t, d2_from_t, d3_from_t);
                    }
                }
            }
        }
    }

    if (supports_k4_graphs(_imp->params)) {
        _build_k4_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, true);
        _build_k4_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, false);
    }

    for (auto & [shape, injective, count] : _imp->params.extra_shapes) {
        _build_extra_shape(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, *shape, injective, count, true);
        _build_extra_shape(_imp->target_graph_rows, target_size, next_target_supplemental, *shape, injective, count, false);

        if (_imp->proof) {
            for (unsigned p = 0; p < pattern_size; ++p) {
                for (unsigned q = 0; q < pattern_size; ++q) {
                    auto named_p = pattern_vertex_for_proof(p);
                    auto named_q = pattern_vertex_for_proof(q);

                    // only do this if they're actually adjacent
                    if (! _imp->pattern_graph_rows[p * max_graphs + next_pattern_supplemental - 1].test(q))
                        continue;

                    for (unsigned t = 0; t < target_size; ++t) {
                        auto named_t = target_vertex_for_proof(t);
                        vector<NamedVertex> named_n_t;
                        auto n_t = _imp->target_graph_rows[t * max_graphs + next_pattern_supplemental - 1];
                        for (auto v = n_t.find_first(); v != decltype(n_t)::npos; v = n_t.find_first()) {
                            n_t.reset(v);
                            named_n_t.push_back(target_vertex_for_proof(v));
                        }
                        _imp->proof->hack_in_shape_graph(next_pattern_supplemental - 1, named_p, named_q, named_t, named_n_t);
                    }
                }
            }
        }
    }

    if (next_pattern_supplemental != max_graphs || next_target_supplemental != max_graphs ||
            next_pattern_supplemental != _imp->supplemental_graph_names.size())
        throw UnsupportedConfiguration{"something has gone wrong with supplemental graph indexing: " + to_string(next_pattern_supplemental) + " " + to_string(next_target_supplemental) + " " + to_string(max_graphs) + " "
        + to_string(_imp->supplemental_graph_names.size())};

    // pattern and target degrees, for supplemental graphs
    for (unsigned g = 1; g < max_graphs; ++g) {
        _imp->patterns_degrees.at(g).resize(pattern_size);
        _imp->targets_degrees.at(g).resize(target_size);
    }

    for (unsigned g = 1; g < max_graphs; ++g) {
        for (unsigned i = 0; i < pattern_size; ++i)
            _imp->patterns_degrees.at(g).at(i) = _imp->pattern_graph_rows[i * max_graphs + g].count();

        for (unsigned i = 0; i < target_size; ++i)
            _imp->targets_degrees.at(g).at(i) = _imp->target_graph_rows[i * max_graphs + g].count();
    }

    for (unsigned i = 0; i < target_size; ++i)
        _imp->largest_target_degree = max(_imp->largest_target_degree, _imp->targets_degrees[0][i]);

    // re-add loops
    for (unsigned i = 0; i < pattern_size; ++i)
        if (_imp->pattern_loops[i])
            _imp->pattern_graph_rows[i * max_graphs + 0].set(i);

    for (unsigned i = 0; i < target_size; ++i)
        if (_imp->target_loops[i])
            _imp->target_graph_rows[i * max_graphs + 0].set(i);

    // pattern adjacencies, compressed
    _imp->pattern_adjacencies_bits.resize(pattern_size * pattern_size);
    for (unsigned g = 0; g < max_graphs; ++g)
        for (unsigned i = 0; i < pattern_size; ++i)
            for (unsigned j = 0; j < pattern_size; ++j)
                if (_imp->pattern_graph_rows[i * max_graphs + g].test(j))
                    _imp->pattern_adjacencies_bits[i * pattern_size + j] |= (1u << g);

    return true;
}